

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MiniParse
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData param_4,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint7 uVar18;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  f;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  f_00;
  undefined7 uVar19;
  TcParseTableBase *pTVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar21;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar22;
  undefined2 uVar23;
  undefined4 uVar24;
  ZeroCopyInputStream *pZVar25;
  int8_t iVar26;
  byte bVar27;
  TypeKind TVar28;
  bool bVar29;
  ushort uVar30;
  ushort uVar31;
  unsigned_short uVar32;
  int32_t iVar33;
  uint uVar34;
  uint32_t uVar35;
  int iVar36;
  int iVar37;
  char *pcVar38;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar39;
  bool *pbVar40;
  unsigned_long *puVar41;
  string *psVar42;
  Cord **ppCVar43;
  FieldAux *pFVar44;
  MessageLite *pMVar45;
  MapFieldBaseForParse *pMVar46;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar47;
  LogMessage *pLVar48;
  Arena *pAVar49;
  int *piVar50;
  uint *puVar51;
  TailCallParseFunc UNRECOVERED_JUMPTABLE_00;
  int iVar52;
  ulong uVar53;
  ulong uVar54;
  uint16_t uVar55;
  string_view wire_bytes;
  string_view wire_bytes_00;
  string_view wire_bytes_01;
  string_view wire_bytes_02;
  byte bStack_4f9;
  TcParseTableBase *pTStack_468;
  bool bStack_452;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_450;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_448;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_440;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_438;
  TypeInfo TStack_42c;
  undefined8 uStack_428;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_420;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_418;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paStack_410;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_408;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_400;
  undefined8 uStack_3f8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_3f0;
  TcParseTableBase *pTStack_3e8;
  FieldAux *pFStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  TcParseTableBase *pTStack_3c8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_3c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_3b8;
  TcParseTableBase *pTStack_3b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_3a0;
  undefined1 auStack_398 [19];
  Voidify VStack_385;
  unsigned_short uStack_384;
  unsigned_short uStack_382;
  undefined8 uStack_380;
  void *pvStack_378;
  undefined8 uStack_370;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_368;
  anon_struct_8_2_e5911a21_for_enum_range aStack_360;
  TypeInfo TStack_354;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_350;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_348;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_340;
  undefined8 uStack_338;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_330;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_328;
  undefined1 uStack_31d;
  ushort uStack_31c;
  undefined1 uStack_31a;
  byte bStack_319;
  FieldAux *pFStack_318;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_310;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_308;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_300;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2f8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2f0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2e8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2e0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2d8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2d0;
  TcFieldData TStack_2c8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2a8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_298;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_290;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_288;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_280;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_278;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_270;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_268;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_260;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_258;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_250;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_248;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_240;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_238;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_230;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_228;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_220;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_218;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_210;
  FieldAux FStack_208;
  undefined8 uStack_200;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1f8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1f0;
  undefined8 uStack_1e8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1e0;
  undefined8 uStack_1d8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1d0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1c8;
  undefined8 uStack_1c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1a8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_198;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_190;
  undefined1 local_188 [16];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_178;
  undefined8 local_170;
  undefined8 local_168;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_160;
  undefined8 uStack_158;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_150;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_148;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData param_3_local;
  TailCallParseFunc parse_fn;
  undefined4 uStack_100;
  int field_type;
  uint64_t entry_offset;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_f0;
  FieldEntry *entry;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_e0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_d8;
  uint32_t tag;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_d0;
  undefined8 local_c8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_a8;
  uint64_t res;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_98;
  undefined8 local_90;
  undefined8 local_88;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_80;
  undefined8 local_78;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_70;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_50;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_48;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_38;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_30;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_28;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_18;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_10;
  
  aStack_190.data = 0x1a7523b;
  local_170 = (char **)msg;
  local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
  local_160 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
  local_148.data = hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)param_4.field_0;
  TcFieldData::TcFieldData((TcFieldData *)&local_150);
  local_b0 = local_150.data;
  local_b8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)local_170;
  local_c8 = local_160;
  local_d0.data = hasbits_local;
  aStack_d8.data = local_148.data;
  local_98.data = local_168;
  res = (long)&aStack_e0 + 4;
  local_a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)(int)(uint)*(byte *)local_168;
  if (local_a8.data < (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x80) {
    aStack_e0.data._4_4_ = (uint)*(byte *)local_168;
    local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_168 + 1);
  }
  else {
    local_58.data = local_168 + 1;
    uVar18 = (uint7)((local_a8.data << 0x39) >> 8);
    local_50.data._1_7_ = uVar18;
    local_50.data._0_1_ = *(byte *)local_58;
    if ((*(byte *)local_58 & 0x80) == 0) {
      aStack_18.data._4_4_ = 7;
      aStack_e0.data._4_4_ = (int)local_50.data << 7 | (uint)((local_a8.data << 0x39) >> 0x39);
      local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_168 + 2);
      local_a8 = local_50;
      local_10 = local_50;
    }
    else {
      local_68.data = local_168 + 2;
      local_60._1_7_ = uVar18 >> 7 | (uint7)((local_50.data << 0x39) >> 8);
      local_60.data._0_1_ = *(byte *)local_68;
      if ((*(byte *)local_68 & 0x80) == 0) {
        aStack_28.data._4_4_ = 0xe;
        aStack_e0.data._4_4_ = (int)local_60.data << 0xe | (uint)(local_60._1_7_ >> 0x2a);
        local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_168 + 3);
        local_a8 = local_60;
        local_20 = local_60;
      }
      else {
        local_78 = local_168 + 3;
        local_70._1_7_ = local_60._1_7_ >> 7 | (uint7)((local_60.data << 0x39) >> 8);
        local_70.data._0_1_ = *(byte *)local_78;
        if ((*(byte *)local_78 & 0x80) == 0) {
          aStack_38.data._4_4_ = 0x15;
          aStack_e0.data._4_4_ = (int)local_70.data << 0x15 | (uint)(local_70._1_7_ >> 0x23);
          local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_168 + 4);
          local_a8 = local_70;
          local_30 = local_70;
        }
        else {
          local_88 = local_168 + 4;
          local_80._1_7_ = local_70._1_7_ >> 7 | (uint7)((local_70.data << 0x39) >> 8);
          local_80.data._0_1_ = *(byte *)local_88;
          local_a8 = local_80;
          if ((*(byte *)local_88 & 0x80) == 0) {
            aStack_48.data._4_4_ = 0x1c;
            aStack_e0.data._4_4_ = (int)local_80.data << 0x1c | (uint)(local_80._1_7_ >> 0x1c);
            local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_168 + 5);
            local_40 = local_80;
          }
          else {
            aStack_e0.data._4_4_ = 0;
            local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0;
          }
        }
      }
    }
  }
  local_c0.data = (uint64_t)local_90;
  if (local_90 == (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
    local_188._0_8_ = local_170;
    local_188._8_8_ = local_90;
    local_178 = local_160;
    aStack_190.data = 0x1a75607;
    TcFieldData::TcFieldData((TcFieldData *)&entry);
    pcVar38 = Error((MessageLite *)local_188._0_8_,(char *)local_188._8_8_,(ParseContext *)local_178
                    ,(TcFieldData)entry,(TcParseTableBase *)local_d0,aStack_d8.data);
    return pcVar38;
  }
  aStack_190.data = 0x1a75653;
  local_f0.data = (uint64_t)FindFieldEntry(hasbits_local,(uint)aStack_e0.data._4_4_ >> 3);
  pMVar45 = (MessageLite *)local_b8;
  aVar47 = local_d0;
  if ((FieldEntry *)local_f0.data == (FieldEntry *)0x0) {
    entry_offset._4_4_ = 0;
    entry_offset._0_4_ = aStack_e0.data._4_4_;
    local_b0 = entry_offset;
    pcVar38 = (**(TailCallParseFunc *)((long)local_d0 + 0x30))
                        ((MessageLite *)local_b8,(char *)local_c0,(ParseContext *)local_c8,
                         (TcFieldData)entry_offset,(TcParseTableBase *)local_d0,aStack_d8.data);
    return pcVar38;
  }
  _uStack_100 = (Nullable<const_char_*>)(local_f0.data - (long)local_d0);
  aStack_2e0.data = (long)_uStack_100 << 0x20 | (ulong)(uint)aStack_e0.data._4_4_;
  parse_fn = (TailCallParseFunc)
             ((ulong)CONCAT24(*(uint16_t *)(local_f0.data + 10),parse_fn._0_4_) & 0xfffffffff);
  aStack_2e8.data = aStack_2e0.data;
  param_3_local.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)aStack_2e0.data;
  local_b0 = aStack_2e0.data;
  switch((&MiniParse<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)
           ::kMiniParseTable)[parse_fn._4_4_]) {
  case (undefined *)0x1a75160:
    aStack_38.data = local_b8;
    local_40.data = local_c0.data;
    aStack_48 = local_c8;
    local_50.data = local_d0.data;
    local_58.data = aStack_d8.data;
    local_10 = local_b8;
    aStack_18.data = aStack_d8.data;
    local_20 = local_d0;
    aStack_28.data._4_2_ = *(uint16_t *)local_d0;
    aStack_28.data._6_2_ = 0;
    aVar47 = aStack_28;
    aStack_28.data._6_2_ = 0;
    if (aStack_28._4_4_ != 0) {
      uVar53 = (ulong)(uint)aStack_28._4_4_;
      local_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1a751bd;
      local_30.data = aStack_2e0.data;
      aStack_28 = aVar47;
      local_60.data._4_4_ = (uint)aStack_d8.data;
      puVar51 = RefAt<unsigned_int>((void *)local_b8,uVar53);
      *puVar51 = local_60._4_4_ | *puVar51;
    }
    return (char *)0x0;
  case (undefined *)0x1a75e70:
    aStack_18 = local_b8;
    local_20.data = local_c0.data;
    aStack_28 = local_c8;
    local_30.data = local_d0.data;
    aStack_38.data = aStack_d8.data;
    local_40.data = aStack_2e0.data;
    local_10.data = aStack_2e0.data;
    pcVar38 = (**(TailCallParseFunc *)((long)local_d0 + 0x30))
                        ((MessageLite *)local_b8,(char *)local_c0,(ParseContext *)local_c8,
                         (TcFieldData)aStack_2e0,(TcParseTableBase *)local_d0,aStack_d8.data);
    return pcVar38;
  case (undefined *)0x1aa7fb0:
    aStack_2f0 = local_b8;
    aStack_2f8.data = local_c0.data;
    aStack_300 = local_c8;
    aStack_308 = local_d0;
    aStack_310.data = aStack_d8.data;
    pTStack_3b0 = (TcParseTableBase *)local_d0;
    aStack_450.data = 0x1aa7fff;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&aStack_2e8);
    aStack_450.data = 0x1aa800f;
    pFStack_318 = (FieldAux *)
                  RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                            (pTStack_3b0,(ulong)uVar35);
    uStack_31c = *(uint16_t *)((long)pFStack_318 + 10);
    uStack_31a = (undefined1)uStack_31c;
    bStack_319 = (byte)(uStack_31c >> 8);
    uStack_31c = uStack_31c & 0x30;
    if (uStack_31c == 0x20) {
      aStack_328.data = aStack_2e8.data;
      pcVar38 = MpRepeatedVarint<false>
                          ((MessageLite *)aStack_2f0,(char *)aStack_2f8,(ParseContext *)aStack_300,
                           (TcFieldData)aStack_2e8,(TcParseTableBase *)aStack_308,aStack_310.data);
      return pcVar38;
    }
    aStack_450.data = 0x1aa8096;
    uVar35 = TcFieldData::tag((TcFieldData *)&aStack_2e8);
    if ((uVar35 & 7) != 0) {
      aStack_330.data = aStack_2e8.data;
      pcVar38 = (**(TailCallParseFunc *)((long)aStack_308 + 0x30))
                          ((MessageLite *)aStack_2f0,(char *)aStack_2f8,(ParseContext *)aStack_300,
                           (TcFieldData)aStack_2e8,(TcParseTableBase *)aStack_308,aStack_310.data);
      return pcVar38;
    }
    uStack_338 = (TcParseTableBase *)
                 (CONCAT26(CONCAT11(bStack_319,uStack_31a),(undefined6)uStack_338) &
                 0x600ffffffffffff);
    uStack_338._0_5_ = CONCAT14((bStack_319 & 4) != 0,(undefined4)uStack_338);
    uStack_338 = (TcParseTableBase *)
                 CONCAT35(CONCAT21(uStack_338._6_2_,uStack_338._6_2_ == 0x200),
                          (undefined5)uStack_338);
    aStack_340 = aStack_2f8;
    aStack_280 = aStack_2f8;
    aStack_288.data = (uint64_t)&aStack_348;
    uStack_158 = aStack_2f8;
    local_160.data = (uint64_t)&aStack_290;
    local_168._0_7_ = (uint7)local_168 & 0xffffffffffff;
    local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)CONCAT17(1,(uint7)local_168);
    local_170 = (char **)&uStack_158;
    local_178.data = (uint64_t)&uStack_158;
    aStack_450.data = 0x1aa81ab;
    iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                       ((anon_class_8_1_54a39810 *)&local_170);
    *(long *)local_160 = (long)iVar26;
    if ((long)*(ulong *)local_160 < 0) {
      aStack_450.data = 0x1aa81e5;
      iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                         ((anon_class_8_1_54a39810 *)&local_170);
      hasbits_local = *local_160.data;
      table_local = (TcParseTableBase *)CONCAT17(iVar26,table_local._0_7_);
      local_148.data = (long)local_188 + 8;
      aStack_e0.data._7_1_ = iVar26;
      local_188._8_8_ = (long)iVar26 << 7 | hasbits_local >> 0x39;
      entry = (FieldEntry *)hasbits_local;
      if ((long)local_188._8_8_ < 0) {
        aStack_450.data = 0x1aa8268;
        iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                           ((anon_class_8_1_54a39810 *)&local_170);
        ptr_local = *(char **)local_160;
        msg_local = (MessageLite *)CONCAT17(iVar26,msg_local._0_7_);
        local_d0.data._7_1_ = iVar26;
        local_188._0_8_ = (long)iVar26 << 0xe | (ulong)ptr_local >> 0x32;
        ctx_local = (ParseContext *)local_188;
        aStack_d8.data = (uint64_t)ptr_local;
        if ((long)local_188._0_8_ < 0) {
          aStack_450.data = 0x1aa82eb;
          ctx_local = (ParseContext *)local_188;
          iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                             ((anon_class_8_1_54a39810 *)&local_170);
          local_c8 = *local_160.data;
          parse_fn = (TailCallParseFunc)CONCAT17(iVar26,parse_fn._0_7_);
          param_3_local.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)local_188 + 8);
          local_c0.data._7_1_ = iVar26;
          local_188._8_8_ = ((long)iVar26 << 0x15 | local_c8 >> 0x2b) & local_188._8_8_;
          if ((long)local_188._8_8_ < 0) {
            aStack_450.data = 0x1aa8371;
            iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                               ((anon_class_8_1_54a39810 *)&local_170);
            entry_offset = *local_160.data;
            local_f0.data._7_1_ = iVar26;
            local_b0._7_1_ = iVar26;
            local_188._0_8_ = ((long)iVar26 << 0x1c | entry_offset >> 0x24) & local_188._0_8_;
            _uStack_100 = local_188;
            local_b8 = entry_offset;
            if ((long)local_188._0_8_ < 0) {
              aStack_450.data = 0x1aa83f7;
              _uStack_100 = local_188;
              iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 ((anon_class_8_1_54a39810 *)&local_170);
              res = *local_160.data;
              local_98.data._7_1_ = iVar26;
              local_a8.data = (long)local_188 + 8;
              local_40.data._7_1_ = iVar26;
              local_188._8_8_ = ((long)iVar26 << 0x23 | res >> 0x1d) & local_188._8_8_;
              aStack_48.data = res;
              if ((long)local_188._8_8_ < 0) {
                aStack_450.data = 0x1aa8471;
                iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   ((anon_class_8_1_54a39810 *)&local_170);
                local_88 = *local_160.data;
                local_80.data._7_1_ = iVar26;
                local_30.data._7_1_ = iVar26;
                local_188._0_8_ = ((long)iVar26 << 0x2a | local_88 >> 0x16) & local_188._0_8_;
                local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_188;
                aStack_38.data = local_88;
                if ((long)local_188._0_8_ < 0) {
                  aStack_450.data = 0x1aa84df;
                  local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_188;
                  iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()((anon_class_8_1_54a39810 *)&local_170);
                  local_70.data = *local_160.data;
                  local_68.data._7_1_ = iVar26;
                  local_78 = (uint64_t)(local_188 + 8);
                  local_20.data._7_1_ = iVar26;
                  local_188._8_8_ = ((long)iVar26 << 0x31 | local_70.data >> 0xf) & local_188._8_8_;
                  aStack_28.data = local_70.data;
                  if ((long)local_188._8_8_ < 0) {
                    aStack_450.data = 0x1aa8544;
                    iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()((anon_class_8_1_54a39810 *)&local_170);
                    local_58.data = *local_160.data;
                    local_50.data._7_1_ = iVar26;
                    local_10.data._7_1_ = iVar26;
                    local_188._0_8_ = ((long)iVar26 << 0x38 | local_58.data >> 8) & local_188._0_8_;
                    local_60.data = (uint64_t)local_188;
                    aStack_18.data = local_58.data;
                    if ((long)local_188._0_8_ < 0) {
                      aStack_450.data = 0x1aa85a6;
                      local_60.data = (uint64_t)local_188;
                      iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                               operator()((anon_class_8_1_54a39810 *)&local_170);
                      if (iVar26 != '\x01') {
                        aStack_450.data = 0x1aa85bc;
                        iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                 operator()((anon_class_8_1_54a39810 *)&local_178);
                        if (((int)iVar26 & 0x80U) != 0) {
                          local_150.data = 0;
                          goto LAB_01aa8665;
                        }
                        aStack_450.data = 0x1aa85e5;
                        bVar27 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                 operator()((anon_class_8_1_54a39810 *)&local_178);
                        if ((bVar27 & 1) == 0) {
                          local_188._0_8_ = local_188._0_8_ ^ 0x8000000000000000;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_188._8_8_ = local_188._0_8_ & local_188._8_8_;
      }
      *(ulong *)local_160 = local_188._8_8_ & *(ulong *)local_160;
      if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)uStack_158 ==
          (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        aStack_450.data = 0x1aa8650;
        protobuf_assumption_failed
                  ("p != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/varint_shuffle.h"
                   ,0x91);
      }
      local_150.data = uStack_158;
    }
    else {
      local_150.data = uStack_158;
    }
LAB_01aa8665:
    aStack_280 = local_150;
    *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_288 = aStack_290;
    aStack_2f8.data = aStack_280.data;
    if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_280.data ==
        (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
      pTStack_3c8 = (TcParseTableBase *)aStack_2f0;
      aStack_3c0.data = aStack_280.data;
      aStack_3b8 = aStack_300;
      aStack_450.data = 0x1aa86d2;
      TcFieldData::TcFieldData((TcFieldData *)&aStack_350);
      pcVar38 = Error((MessageLite *)pTStack_3c8,(char *)aStack_3c0,(ParseContext *)aStack_3b8,
                      (TcFieldData)aStack_350,(TcParseTableBase *)aStack_308,aStack_310.data);
      return pcVar38;
    }
    TStack_354 = (TypeInfo)(CONCAT22(TStack_354._2_2_,CONCAT11(bStack_319,uStack_31a)) & 0xffff01c0)
    ;
    if (TStack_354.node_size == 0xc0) {
      if (((ulong)uStack_338 & 0x10000000000) != 0) {
        aStack_450.data = 0x1aa873f;
        aStack_348.data = WireFormatLite::ZigZagDecode64(aStack_348.data);
      }
    }
    else if (TStack_354.node_size == 0x80) {
      if (((ulong)uStack_338 & 0x100000000) == 0) {
        if (((ulong)uStack_338 & 0x10000000000) != 0) {
          aStack_450.data = 0x1aa88a5;
          iVar33 = WireFormatLite::ZigZagDecode32((uint32_t)aStack_348.data);
          aStack_348 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar33;
        }
      }
      else {
        uStack_3d0 = (TcParseTableBase *)CONCAT44(uStack_3d0._4_4_,(uint32_t)aStack_348.data);
        uStack_3d0 = (TcParseTableBase *)CONCAT26(uStack_338._6_2_,(undefined6)uStack_3d0);
        aStack_450.data = 0x1aa8798;
        pFVar44 = TcParseTableBase::field_aux
                            ((TcParseTableBase *)aStack_308,(FieldEntry *)&pFStack_318->enum_range);
        aStack_360 = pFVar44->enum_range;
        aStack_1d0.data._2_2_ = uStack_3d0._6_2_;
        aStack_1d0.data._4_4_ = (int)uStack_3d0;
        aStack_1c8._0_4_ = aStack_360.first;
        aStack_1c8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)aStack_360;
        if (uStack_3d0._6_2_ == 0x600) {
          uVar19 = (undefined7)uStack_3d8;
          uStack_3d8 = (FieldAux **)((ulong)uStack_3d8 & 0xffffffffffffff);
          if ((int)aStack_1c8._0_4_ <= (int)uStack_3d0) {
            aStack_1c8._4_4_ = aStack_360.last;
            uStack_3d8 = (FieldAux **)CONCAT17((int)uStack_3d0 <= (int)aStack_1c8._4_4_,uVar19);
          }
          uStack_1c0._3_1_ = uStack_3d8._7_1_;
        }
        else {
          aStack_450.data = 0x1aa8828;
          uVar24 = aStack_1c8._0_4_;
          bVar29 = ValidateEnum((internal *)((ulong)uStack_3d0 & 0xffffffff),uVar24,
                                (uint32_t *)aStack_360);
          uStack_1c0._3_1_ = bVar29;
        }
        if (uStack_1c0._3_1_ == '\0') {
          aStack_2f8 = aStack_340;
          aStack_368 = aStack_2e8;
          pcVar38 = MpUnknownEnumFallback
                              ((MessageLite *)aStack_2f0,(char *)aStack_340,
                               (ParseContext *)aStack_300,(TcFieldData)aStack_2e8,
                               (TcParseTableBase *)aStack_308,aStack_310.data);
          return pcVar38;
        }
      }
    }
    uStack_370 = CONCAT17(uStack_31c == 0x30,(undefined7)uStack_370);
    if (uStack_31c == 0x10) {
      aStack_450.data = 0x1aa88e8;
      anon_unknown_104::SetHas((FieldEntry *)&pFStack_318->enum_range,(MessageLite *)aStack_2f0);
    }
    else if (uStack_31c == 0x30) {
      pTStack_3e8 = (TcParseTableBase *)aStack_308;
      pFStack_3e0 = pFStack_318;
      aStack_450.data = 0x1aa891b;
      uVar35 = TcFieldData::tag((TcFieldData *)&aStack_2e8);
      aStack_450.data = 0x1aa8941;
      ChangeOneof(pTStack_3e8,(FieldEntry *)&pFStack_3e0->enum_range,uVar35 >> 3,
                  (ParseContext *)aStack_300,(MessageLite *)aStack_2f0);
    }
    aStack_450.data = 0x1aa8958;
    pvStack_378 = MaybeGetSplitBase((MessageLite *)aStack_2f0,false,(TcParseTableBase *)aStack_308);
    if (TStack_354.node_size == 0xc0) {
      aStack_3f0.data = aStack_348.data;
      aStack_450.data = 0x1aa8992;
      paVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                RefAt<unsigned_long>(pvStack_378,(ulong)(uint)(pFStack_318->enum_range).first);
      paVar39->data = (uint64_t)aStack_3f0;
    }
    else if (TStack_354.node_size == 0x80) {
      uStack_3f8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                   CONCAT44((int)aStack_348.data,(undefined4)uStack_3f8);
      aStack_450.data = 0x1aa89d3;
      puVar51 = RefAt<unsigned_int>(pvStack_378,(ulong)(uint)(pFStack_318->enum_range).first);
      *puVar51 = uStack_3f8._4_4_;
    }
    else {
      aStack_450.data = 0x1aa89ee;
      uStack_382 = absl::lts_20250127::log_internal::GetReferenceableValue(TStack_354.node_size);
      aStack_450.data = 0x1aa89fc;
      uStack_384 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      aStack_450.data = 0x1aa8a1d;
      uStack_380 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                             (&uStack_382,&uStack_384,
                              "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
      if (uStack_380 != (Nullable<const_char_*>)0x0) {
        aStack_450.data = 0x1aa8a3a;
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>(uStack_380);
        aStack_450.data = 0x1aa8a55;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)auStack_398,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,pcVar38);
        aStack_450.data = 0x1aa8a61;
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)auStack_398);
        aStack_450.data = 0x1aa8a70;
        absl::lts_20250127::log_internal::Voidify::operator&&(&VStack_385,pLVar48);
        aStack_450.data = 0x1aa8a7c;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)auStack_398);
      }
      uStack_3f8._0_4_ =
           CONCAT13((FieldEntry *)aStack_348.data != (FieldEntry *)0x0,(undefined3)uStack_3f8);
      aStack_450.data = 0x1aa8aa4;
      pbVar40 = RefAt<bool>(pvStack_378,(ulong)(uint)(pFStack_318->enum_range).first);
      *pbVar40 = (bool)(uStack_3f8._3_1_ & 1);
    }
    paStack_410 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_2f0;
    aStack_408 = aStack_2f8;
    aStack_400 = aStack_300;
    aStack_450.data = 0x1aa8ae7;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_3a0);
    aStack_298 = aStack_3a0;
    aStack_2a0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)paStack_410;
    aStack_2a8 = aStack_408;
    aStack_2b0 = aStack_400;
    aStack_2b8 = aStack_308;
    aStack_2c0 = aStack_310;
    TStack_2c8.field_0.data._7_1_ = 0;
    aStack_450.data = 0x1aa8b55;
    bVar29 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)aStack_400,(char *)aStack_408);
    if (!bVar29) {
      uStack_428 = (MessageLite *)aStack_2a0;
      aStack_420 = aStack_2a8;
      aStack_418 = aStack_2b0;
      aStack_450.data = 0x1aa8b93;
      TcFieldData::TcFieldData((TcFieldData *)&aStack_2d0);
      aStack_1f8 = aStack_2d0;
      uStack_200 = (ParseContext *)uStack_428;
      FStack_208 = (FieldAux)aStack_420;
      aStack_210 = aStack_418;
      aStack_218 = aStack_2b8;
      aStack_220.data = aStack_2c0.data;
      uStack_1d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)uStack_428;
      aStack_1e0.data = aStack_2c0.data;
      uStack_1e8 = aStack_2b8;
      aStack_1f0.data._4_2_ = *(uint16_t *)aStack_2b8;
      aStack_1f0.data._6_2_ = 0;
      aVar47 = aStack_1f0;
      aStack_1f0.data._6_2_ = 0;
      if (aStack_1f0._4_4_ != 0) {
        TStack_42c = SUB84(aStack_2c0.data,0);
        uVar53 = (ulong)(uint)aStack_1f0._4_4_;
        aStack_450.data = 0x1aa8c4b;
        aStack_1f0 = aVar47;
        puVar51 = RefAt<unsigned_int>(uStack_428,uVar53);
        *puVar51 = (uint)TStack_42c | *puVar51;
      }
      return (char *)((anon_union_8_1_898a9ca8_for_TcFieldData_0)FStack_208).data;
    }
    aStack_448 = aStack_2a0;
    aStack_440 = aStack_2a8;
    aStack_438 = aStack_2b0;
    aStack_450.data = 0x1aa8c9b;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_2d8);
    aStack_228 = aStack_2d8;
    aStack_230 = aStack_448;
    aStack_238 = aStack_440;
    aStack_240 = aStack_438;
    aStack_248 = aStack_2b8;
    aStack_250.data = aStack_2c0.data;
    aStack_450.data = 0x1aa8cfb;
    uVar32 = UnalignedLoad<unsigned_short>((char *)aStack_440);
    aStack_260 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 (long)(int)((uint)uVar32 & (uint)*(uint8_t *)((long)aStack_248 + 8));
    aStack_258.data._6_2_ = uVar32;
    if ((aStack_260.data & 7) != 0) {
      aStack_450.data = 0x1aa8d48;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    aStack_450.data = 0x1aa8d5f;
    aStack_268.data = (uint64_t)TcParseTableBase::fast_entry(aStack_248.data,aStack_260.data >> 3);
    aStack_270.data =
         (((FastFieldEntry *)aStack_268.data)->bits).field_0.data ^ (ulong)(ushort)aStack_258._6_2_;
    aStack_450.data = 0x1aa8d9e;
    UNRECOVERED_JUMPTABLE_00 =
         TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)aStack_268);
    aStack_278.data = aStack_270.data;
    pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                        ((MessageLite *)aStack_230,(char *)aStack_238,(ParseContext *)aStack_240,
                         (TcFieldData)aStack_270,(TcParseTableBase *)aStack_248,aStack_250.data);
    return pcVar38;
  case (undefined *)0x1aa8de0:
    local_40.data = local_b8;
    aStack_48.data = local_c0.data;
    local_50 = local_c8;
    local_58 = local_d0;
    local_60.data = aStack_d8.data;
    entry = (FieldEntry *)local_d0;
    _uStack_100 = (Nullable<const_char_*>)0x1aa8e17;
    aStack_38.data = aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&aStack_38);
    _uStack_100 = (Nullable<const_char_*>)0x1aa8e27;
    local_68 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(entry,(ulong)uVar35);
    local_70.data._6_2_ = ((FieldEntry *)local_68.data)->type_card;
    _uStack_100 = (Nullable<const_char_*>)0x1aa8e40;
    uVar35 = TcFieldData::tag((TcFieldData *)&aStack_38);
    local_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (CONCAT44(local_70._4_4_,uVar35) & 0xffffffff00000007);
    if (local_70._0_4_ != 2) {
      local_78 = aStack_38.data;
      pcVar38 = MpRepeatedVarint<false>
                          ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                           (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
      return pcVar38;
    }
    local_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (CONCAT26(local_70._6_2_,local_80._0_6_) & 0x600ffffffffffff);
    local_10.data = local_40.data;
    aStack_18.data = local_60.data;
    local_20 = local_58;
    aStack_28.data._4_2_ = *(uint16_t *)local_58;
    aStack_28.data._6_2_ = 0;
    aVar47 = aStack_28;
    aStack_28.data._6_2_ = 0;
    if (aStack_28._4_4_ != 0) {
      local_f0.data._4_4_ = (int)local_60.data;
      uVar53 = (ulong)(uint)aStack_28._4_4_;
      _uStack_100 = (Nullable<const_char_*>)0x1aa8ec6;
      aStack_28 = aVar47;
      puVar51 = RefAt<unsigned_int>((void *)local_40,uVar53);
      *puVar51 = local_f0.data._4_4_ | *puVar51;
      aVar47 = aStack_28;
    }
    aStack_28 = aVar47;
    local_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (CONCAT26(local_80._6_2_,CONCAT24(local_70._6_2_,local_80._0_4_)) &
               0xffff01c0ffffffff);
    uVar34 = CONCAT22(0,(ushort)local_80._4_2_ >> 6);
    local_f0.data._0_4_ = uVar34;
    if ((ushort)local_80._4_2_ >> 6 == 0) {
      aStack_e0.data = aStack_38.data;
      pcVar38 = MpPackedVarintT<false,bool,(unsigned_short)0>
                          ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                           (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
      return pcVar38;
    }
    if (uVar34 == 2) {
      entry_offset = (uint64_t)((ushort)local_80._6_2_ >> 9);
      switch(entry_offset) {
      case 0:
        local_c0.data = aStack_38.data;
        pcVar38 = MpPackedVarintT<false,unsigned_int,(unsigned_short)0>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      case 1:
        local_c8 = aStack_38.data;
        pcVar38 = MpPackedVarintT<false,unsigned_int,(unsigned_short)512>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      case 2:
        local_d0.data = aStack_38.data;
        pcVar38 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      case 3:
        aStack_d8.data = aStack_38.data;
        pcVar38 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1536>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      default:
        _uStack_100 = (Nullable<const_char_*>)0x1aa9127;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x8f2);
      }
    }
    if (uVar34 == 3) {
      if (local_80._6_2_ == 0) {
        local_88 = aStack_38.data;
        pcVar38 = MpPackedVarintT<false,unsigned_long,(unsigned_short)0>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      }
      _uStack_100 = (Nullable<const_char_*>)0x1aa8f57;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(local_80._6_2_);
      local_98.data._6_2_ = uVar32;
      _uStack_100 = (Nullable<const_char_*>)0x1aa8f68;
      iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue(0x200);
      local_98.data._0_4_ = iVar36;
      _uStack_100 = (Nullable<const_char_*>)0x1aa8f88;
      local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                 absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,int>
                           ((unsigned_short *)((long)&local_98 + 6),(int *)&local_98.data,
                            "xform_val == +field_layout::kTvZigZag");
      if (local_90 != (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        _uStack_100 = (Nullable<const_char_*>)0x1aa8fa5;
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)&local_90->data);
        _uStack_100 = (Nullable<const_char_*>)0x1aa8fc0;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x8db,pcVar38);
        _uStack_100 = (Nullable<const_char_*>)0x1aa8fcc;
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&local_b0);
        _uStack_100 = (Nullable<const_char_*>)0x1aa8fdb;
        absl::lts_20250127::log_internal::Voidify::operator&&((Voidify *)((long)&res + 7),pLVar48);
        _uStack_100 = (Nullable<const_char_*>)0x1aa8fe7;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      local_b8 = aStack_38;
      pcVar38 = MpPackedVarintT<false,unsigned_long,(unsigned_short)512>
                          ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                           (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
      return pcVar38;
    }
    _uStack_100 = &UNK_01aa916b;
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0x8f9);
  case (undefined *)0x1aa9170:
    param_3_local.field_0 = local_c0;
    msg_local = (MessageLite *)local_c8;
    ptr_local = (char *)local_d0;
    ctx_local = (ParseContext *)aStack_d8;
    aStack_1a0 = local_d0;
    aStack_220.data = 0x1aa91bf;
    parse_fn = (TailCallParseFunc)aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&parse_fn);
    aStack_220.data = 0x1aa91cf;
    table_local = (TcParseTableBase *)
                  RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                            ((void *)aStack_1a0,(ulong)uVar35);
    hasbits_local =
         CONCAT26(table_local->lookup_table_offset,
                  CONCAT24(table_local->lookup_table_offset,(int)hasbits_local)) &
         0xffff0030ffffffff;
    if (hasbits_local._4_2_ == 0x20) {
      local_148 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
      pcVar38 = MpRepeatedFixed<false>
                          (pMVar45,(char *)param_3_local.field_0,(ParseContext *)msg_local,
                           (TcFieldData)parse_fn,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
      return pcVar38;
    }
    local_150.data = CONCAT26(hasbits_local._6_2_,local_150.data._0_6_) & 0x1c0ffffffffffff;
    aStack_220.data = 0x1aa9269;
    uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
    local_150.data = CONCAT44(local_150.data._4_4_,uVar35) & 0xffffffff00000007;
    if (local_150.data._6_2_ == 0xc0) {
      if (local_150.data._0_4_ != 1) {
        uStack_158 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
        pcVar38 = (char *)(**(code **)(ptr_local + 0x30))
                                    (pMVar45,param_3_local.field_0,msg_local,parse_fn,ptr_local,
                                     ctx_local);
        return pcVar38;
      }
    }
    else {
      aStack_220.data = 0x1aa92e9;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(local_150.data._6_2_);
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)CONCAT26(uVar32,(undefined6)local_168);
      aStack_220.data = 0x1aa92fa;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
      local_168._4_2_ = uVar32;
      aStack_220.data = 0x1aa931b;
      local_160 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)((long)&local_168 + 6),
                             (unsigned_short *)((long)&local_168 + 4),
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      if ((Nullable<const_char_*>)local_160.data != (Nullable<const_char_*>)0x0) {
        aStack_220.data = 0x1aa9338;
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)local_160);
        aStack_220.data = 0x1aa9353;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_178,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar38);
        aStack_220.data = 0x1aa935f;
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&local_178);
        aStack_220.data = 0x1aa936e;
        absl::lts_20250127::log_internal::Voidify::operator&&
                  ((Voidify *)((long)&local_168 + 3),pLVar48);
        aStack_220.data = 0x1aa937a;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_178);
      }
      if (local_150.data._0_4_ != 5) {
        local_188._8_8_ = parse_fn;
        pcVar38 = (char *)(**(code **)(ptr_local + 0x30))
                                    (pMVar45,param_3_local.field_0,msg_local,parse_fn,ptr_local,
                                     ctx_local);
        return pcVar38;
      }
      local_160.data = 0;
    }
    if (hasbits_local._4_2_ == 0x10) {
      aStack_220.data = 0x1aa93f1;
      anon_unknown_104::SetHas((FieldEntry *)table_local,pMVar45);
    }
    else if (hasbits_local._4_2_ == 0x30) {
      aStack_1b0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
      aStack_1a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_local;
      aStack_220.data = 0x1aa9427;
      uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
      aStack_220.data = 0x1aa944d;
      ChangeOneof((TcParseTableBase *)aStack_1b0,(FieldEntry *)aStack_1a8,uVar35 >> 3,
                  (ParseContext *)msg_local,pMVar45);
    }
    aStack_220.data = 0x1aa9464;
    local_188._0_8_ = MaybeGetSplitBase(pMVar45,false,(TcParseTableBase *)ptr_local);
    if (local_150.data._6_2_ == 0xc0) {
      aStack_220.data = 0x1aa9485;
      aStack_1b8.data = UnalignedLoad<unsigned_long>(param_3_local.field_0);
      uVar1._0_2_ = table_local->has_bits_offset;
      uVar1._2_2_ = table_local->extension_offset;
      aStack_220.data = 0x1aa94a3;
      puVar41 = RefAt<unsigned_long>((void *)local_188._0_8_,(ulong)uVar1);
      *puVar41 = (unsigned_long)aStack_1b8;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)param_3_local.field_0 + 8);
    }
    else {
      aStack_220.data = 0x1aa94cd;
      uVar34 = UnalignedLoad<unsigned_int>((char *)param_3_local.field_0);
      uStack_1c0._4_4_ = uVar34;
      uVar2._0_2_ = table_local->has_bits_offset;
      uVar2._2_2_ = table_local->extension_offset;
      aStack_220.data = 0x1aa94ea;
      puVar51 = RefAt<unsigned_int>((void *)local_188._0_8_,(ulong)uVar2);
      *puVar51 = uStack_1c0._4_4_;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)param_3_local.field_0 + 4);
    }
    uStack_1d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
    aStack_1d0 = param_3_local.field_0;
    aStack_1c8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
    aStack_220.data = 0x1aa953a;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_190);
    local_b8 = aStack_190;
    local_c0.data = uStack_1d8;
    local_c8 = aStack_1d0;
    local_d0 = aStack_1c8;
    aStack_d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
    aStack_e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx_local;
    entry = (FieldEntry *)((ulong)entry & 0xffffffffffffff);
    aStack_220.data = 0x1aa95a8;
    bVar29 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)aStack_1c8,(char *)aStack_1d0);
    if (!bVar29) {
      aStack_1f0.data = local_c0.data;
      uStack_1e8 = local_c8;
      aStack_1e0 = local_d0;
      aStack_220.data = 0x1aa95e6;
      TcFieldData::TcFieldData((TcFieldData *)&local_f0);
      local_30 = local_f0;
      aStack_38 = aStack_1f0;
      local_40 = uStack_1e8;
      aStack_48 = aStack_1e0;
      local_50.data = aStack_d8.data;
      local_58.data = aStack_e0.data;
      local_10 = aStack_1f0;
      aStack_18.data = aStack_e0.data;
      local_20 = aStack_d8;
      aStack_28.data._4_2_ = ((TcParseTableBase *)aStack_d8.data)->has_bits_offset;
      aStack_28.data._6_2_ = 0;
      aVar47 = aStack_28;
      aStack_28.data._6_2_ = 0;
      if (aStack_28._4_4_ != 0) {
        aStack_1f8.data._4_4_ = (undefined4)aStack_e0.data;
        uVar53 = (ulong)(uint)aStack_28._4_4_;
        aStack_220.data = 0x1aa9668;
        aStack_28 = aVar47;
        puVar51 = RefAt<unsigned_int>((void *)aStack_1f0,uVar53);
        *puVar51 = aStack_1f8._4_4_ | *puVar51;
      }
      return (char *)local_40.data;
    }
    aStack_210.data = local_c0.data;
    FStack_208 = (FieldAux)local_c8;
    uStack_200 = (ParseContext *)local_d0;
    aStack_220.data = 0x1aa96b5;
    TcFieldData::TcFieldData((TcFieldData *)&entry_offset);
    local_60.data = entry_offset;
    local_68 = aStack_210;
    local_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)FStack_208;
    local_78 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)uStack_200;
    local_80 = aStack_d8;
    local_88 = aStack_e0.data;
    aStack_220.data = 0x1aa9700;
    uVar32 = UnalignedLoad<unsigned_short>((char *)FStack_208);
    local_98 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (long)(int)((uint)uVar32 & (uint)*(uint8_t *)((long)local_80 + 8));
    local_90._6_2_ = uVar32;
    if ((local_98.data & 7) != 0) {
      aStack_220.data = 0x1aa974a;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    aStack_220.data = 0x1aa975e;
    res = (uint64_t)TcParseTableBase::fast_entry(local_80.data,local_98.data >> 3);
    local_a8.data = (((FastFieldEntry *)res)->bits).field_0.data ^ (ulong)local_90._6_2_;
    aStack_220.data = 0x1aa979d;
    UNRECOVERED_JUMPTABLE_00 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)res);
    local_b0 = local_a8.data;
    pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                        ((MessageLite *)local_68,(char *)local_70,(ParseContext *)local_78,
                         (TcFieldData)local_a8,(TcParseTableBase *)local_80,local_88);
    return pcVar38;
  case (undefined *)0x1aa97d0:
    param_3_local.field_0 = local_c0;
    msg_local = (MessageLite *)local_c8;
    ptr_local = (char *)local_d0;
    ctx_local = (ParseContext *)aStack_d8;
    aStack_1b0.data = local_d0.data;
    aStack_220.data = 0x1aa981f;
    parse_fn = (TailCallParseFunc)aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&parse_fn);
    aStack_220.data = 0x1aa982f;
    table_local = (TcParseTableBase *)
                  RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                            ((void *)aStack_1b0,(ulong)uVar35);
    hasbits_local = CONCAT26(table_local->lookup_table_offset,(undefined6)hasbits_local);
    aStack_220.data = 0x1aa9854;
    uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
    hasbits_local = CONCAT44(hasbits_local._4_4_,uVar35) & 0xffffffff00000007;
    if ((int)hasbits_local != 2) {
      local_148 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
      pcVar38 = MpRepeatedFixed<false>
                          (pMVar45,(char *)param_3_local.field_0,(ParseContext *)msg_local,
                           (TcFieldData)parse_fn,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
      return pcVar38;
    }
    aStack_220.data = 0x1aa98c0;
    local_150 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                MaybeGetSplitBase(pMVar45,false,(TcParseTableBase *)ptr_local);
    aStack_220.data = 0x1aa98d3;
    uVar35 = ReadSize((char **)&param_3_local);
    uStack_158 = CONCAT44(uVar35,CONCAT22(hasbits_local._6_2_,(ushort)uStack_158)) &
                 0xffffffff01c0ffff;
    if (uStack_158._2_2_ == 0xc0) {
      uVar3._0_2_ = table_local->has_bits_offset;
      uVar3._2_2_ = table_local->extension_offset;
      aStack_220.data = 0x1aa9918;
      local_160.data =
           (uint64_t)
           MaybeCreateRepeatedFieldRefAt<unsigned_long,false>(local_150.data,(ulong)uVar3,pMVar45);
      aStack_220.data = 0x1aa993f;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                     ((EpsCopyInputStream *)msg_local,(char *)param_3_local.field_0,uStack_158._4_4_
                      ,(RepeatedField<unsigned_long> *)local_160);
    }
    else {
      aStack_220.data = 0x1aa9959;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(uStack_158._2_2_);
      local_170._6_2_ = uVar32;
      aStack_220.data = 0x1aa996a;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
      local_170._4_2_ = uVar32;
      aStack_220.data = 0x1aa998b;
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)((long)&local_170 + 6),
                             (unsigned_short *)((long)&local_170 + 4),
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      if ((Arena *)local_168 != (Arena *)0x0) {
        aStack_220.data = 0x1aa99a8;
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)local_168);
        aStack_220.data = 0x1aa99c3;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)(local_188 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar38);
        aStack_220.data = 0x1aa99cf;
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)(local_188 + 8));
        aStack_220.data = 0x1aa99de;
        absl::lts_20250127::log_internal::Voidify::operator&&
                  ((Voidify *)((long)&local_170 + 3),pLVar48);
        aStack_220.data = 0x1aa99ea;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)(local_188 + 8));
      }
      uVar4._0_2_ = table_local->has_bits_offset;
      uVar4._2_2_ = table_local->extension_offset;
      aStack_220.data = 0x1aa9a08;
      local_188._0_8_ =
           MaybeCreateRepeatedFieldRefAt<unsigned_int,false>((void *)local_150,(ulong)uVar4,pMVar45)
      ;
      aStack_220.data = 0x1aa9a2f;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                     ((EpsCopyInputStream *)msg_local,(char *)param_3_local.field_0,uStack_158._4_4_
                      ,(RepeatedField<unsigned_int> *)local_188._0_8_);
    }
    if (param_3_local.field_0 == 0) {
      aStack_1c8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
      uStack_1c0 = param_3_local.field_0;
      aStack_1b8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
      aStack_220.data = 0x1aa9a76;
      TcFieldData::TcFieldData((TcFieldData *)&aStack_190);
      pcVar38 = Error((MessageLite *)aStack_1c8,(char *)uStack_1c0,(ParseContext *)aStack_1b8,
                      (TcFieldData)aStack_190,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
      return pcVar38;
    }
    aStack_1e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
    uStack_1d8 = param_3_local.field_0;
    aStack_1d0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
    aStack_220.data = 0x1aa9ae3;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_1a0);
    local_b8 = aStack_1a0;
    local_c0.data = aStack_1e0.data;
    local_c8 = uStack_1d8;
    local_d0 = aStack_1d0;
    aStack_d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
    aStack_e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx_local;
    entry = (FieldEntry *)((ulong)entry & 0xffffffffffffff);
    aStack_220.data = 0x1aa9b51;
    bVar29 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)aStack_1d0,(char *)uStack_1d8);
    if (!bVar29) {
      aStack_1f8.data = local_c0.data;
      aStack_1f0 = local_c8;
      uStack_1e8 = local_d0;
      aStack_220.data = 0x1aa9b8f;
      TcFieldData::TcFieldData((TcFieldData *)&local_f0);
      local_30 = local_f0;
      aStack_38 = aStack_1f8;
      local_40 = aStack_1f0;
      aStack_48 = uStack_1e8;
      local_50.data = aStack_d8.data;
      local_58 = aStack_e0;
      local_10 = aStack_1f8;
      aStack_18 = aStack_e0;
      local_20 = aStack_d8;
      aStack_28.data._4_2_ = ((TcParseTableBase *)aStack_d8.data)->has_bits_offset;
      aStack_28.data._6_2_ = 0;
      aVar47 = aStack_28;
      aStack_28.data._6_2_ = 0;
      if (aStack_28._4_4_ != 0) {
        uVar53 = (ulong)(uint)aStack_28._4_4_;
        aStack_220.data = 0x1aa9c11;
        aStack_28 = aVar47;
        puVar51 = RefAt<unsigned_int>((void *)aStack_1f8,uVar53);
        *puVar51 = (uint)((ulong)uStack_200 >> 0x20) | *puVar51;
      }
      return (char *)local_40.data;
    }
    aStack_218.data = local_c0.data;
    aStack_210 = local_c8;
    FStack_208 = (FieldAux)local_d0;
    aStack_220.data = 0x1aa9c5e;
    TcFieldData::TcFieldData((TcFieldData *)&entry_offset);
    local_60.data = entry_offset;
    local_68 = aStack_218;
    local_70 = aStack_210;
    local_78 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)FStack_208;
    local_80 = aStack_d8;
    local_88 = aStack_e0;
    aStack_220.data = 0x1aa9ca9;
    uVar32 = UnalignedLoad<unsigned_short>((char *)aStack_210);
    local_98 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (long)(int)((uint)uVar32 & (uint)*(uint8_t *)((long)local_80 + 8));
    local_90._6_2_ = uVar32;
    if ((local_98.data & 7) != 0) {
      aStack_220.data = 0x1aa9cf3;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    aStack_220.data = 0x1aa9d07;
    res = (uint64_t)TcParseTableBase::fast_entry(local_80.data,local_98.data >> 3);
    local_a8.data = (((FastFieldEntry *)res)->bits).field_0.data ^ (ulong)local_90._6_2_;
    aStack_220.data = 0x1aa9d46;
    UNRECOVERED_JUMPTABLE_00 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)res);
    local_b0 = local_a8.data;
    pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                        ((MessageLite *)local_68,(char *)local_70,(ParseContext *)local_78,
                         (TcFieldData)local_a8,(TcParseTableBase *)local_80,local_88);
    return pcVar38;
  case (undefined *)0x1aa9d80:
    param_3_local.field_0 = local_c0;
    msg_local = (MessageLite *)local_c8;
    ptr_local = (char *)local_d0;
    ctx_local = (ParseContext *)aStack_d8;
    aStack_1d0 = local_d0;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aa9dcf;
    aVar47 = aStack_d8;
    parse_fn = (TailCallParseFunc)aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&parse_fn);
    uVar55 = (uint16_t)aVar47.data;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aa9ddf;
    table_local = (TcParseTableBase *)
                  RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                            ((void *)aStack_1d0,(ulong)uVar35);
    hasbits_local =
         CONCAT26(table_local->lookup_table_offset,
                  CONCAT24(table_local->lookup_table_offset,(int)hasbits_local)) &
         0xffff0030ffffffff;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aa9e15;
    uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
    hasbits_local = CONCAT44(hasbits_local._4_4_,uVar35) & 0xffffffff00000007;
    if ((int)hasbits_local != 2) {
      local_148 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
      pcVar38 = (char *)(**(code **)(ptr_local + 0x30))
                                  (pMVar45,param_3_local.field_0,msg_local,parse_fn,ptr_local,
                                   ctx_local);
      return pcVar38;
    }
    if (hasbits_local._4_2_ == 0x20) {
      local_150 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
      pcVar38 = MpRepeatedString<false>
                          (pMVar45,(char *)param_3_local.field_0,(ParseContext *)msg_local,
                           (TcFieldData)parse_fn,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
      return pcVar38;
    }
    uStack_158 = CONCAT26(hasbits_local._6_2_,(undefined6)uStack_158) & 0x600ffffffffffff;
    uStack_158 = CONCAT26(uStack_158._6_2_,CONCAT24(hasbits_local._6_2_,(undefined4)uStack_158)) &
                 0xffff01c0ffffffff;
    uStack_158._0_4_ = CONCAT13(hasbits_local._4_2_ == 0x30,(undefined3)uStack_158);
    uStack_158 = CONCAT53(uStack_158._3_5_,(undefined3)uStack_158) & 0xffffffffff00ffff;
    if (hasbits_local._4_2_ == 0x10) {
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aa9f26;
      anon_unknown_104::SetHas((FieldEntry *)table_local,pMVar45);
    }
    else if (hasbits_local._4_2_ == 0x30) {
      aStack_1e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
      uStack_1d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_local;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aa9f59;
      uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aa9f7f;
      bVar29 = ChangeOneof((TcParseTableBase *)aStack_1e0,(FieldEntry *)uStack_1d8,uVar35 >> 3,
                           (ParseContext *)msg_local,pMVar45);
      uStack_158._0_3_ = CONCAT12(bVar29,(ushort)uStack_158);
    }
    uStack_158._0_2_ = (ushort)(byte)(undefined1)uStack_158;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aa9fa5;
    local_160 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                MaybeGetSplitBase(pMVar45,false,(TcParseTableBase *)ptr_local);
    uStack_1e8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 (ulong)CONCAT24(uStack_158._4_2_,(undefined4)uStack_1e8);
    if (uStack_158._4_2_ == 0) {
      uVar5._0_2_ = table_local->has_bits_offset;
      uVar5._2_2_ = table_local->extension_offset;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aa9fff;
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  RefAt<google::protobuf::internal::ArenaStringPtr>((void *)local_160,(ulong)uVar5);
      if ((uStack_158 & 0x10000) != 0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa01b;
        ArenaStringPtr::InitDefault((ArenaStringPtr *)local_168);
      }
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa027;
      local_170 = (char **)protobuf::MessageLite::GetArena(pMVar45);
      if ((MessageLite *)local_170 == (MessageLite *)0x0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa072;
        local_178.data = (uint64_t)ArenaStringPtr::MutableNoCopy_abi_cxx11_(local_168,(Arena *)0x0);
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa093;
        param_3_local.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             InlineGreedyStringParser
                       ((string *)local_178,(char *)param_3_local.field_0,(ParseContext *)msg_local)
        ;
      }
      else {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa059;
        param_3_local.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             EpsCopyInputStream::ReadArenaString
                       ((EpsCopyInputStream *)msg_local,(char *)param_3_local.field_0,
                        (ArenaStringPtr *)local_168,(Arena *)local_170);
      }
      if (param_3_local.field_0 == 0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa0b7;
        anon_unknown_104::EnsureArenaStringIsNotDefault(pMVar45,(ArenaStringPtr *)local_168);
      }
      else {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa0c8;
        psVar42 = ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)local_168);
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa0d0;
        local_188 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar42);
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa10a;
        wire_bytes._M_str = ptr_local;
        wire_bytes._M_len = local_188._8_8_;
        bVar29 = MpVerifyUtf8(local_188._0_8_,wire_bytes,table_local,
                              (FieldEntry *)(uStack_158 >> 0x30),uVar55);
        uStack_158._0_2_ = CONCAT11(bVar29,(undefined1)uStack_158);
      }
    }
    else if (uStack_158._4_2_ == 0x80) {
      if ((uStack_158 & 0x1000000) == 0) {
        uVar9._0_2_ = table_local->has_bits_offset;
        uVar9._2_2_ = table_local->extension_offset;
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa28f;
        aStack_1a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     RefAt<absl::lts_20250127::Cord>((void *)local_160,(ulong)uVar9);
      }
      else if ((uStack_158 & 0x10000) == 0) {
        uVar8._0_2_ = table_local->has_bits_offset;
        uVar8._2_2_ = table_local->extension_offset;
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa26c;
        ppCVar43 = RefAt<absl::lts_20250127::Cord*>(pMVar45,(ulong)uVar8);
        aStack_1a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)*ppCVar43;
      }
      else {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa215;
        pAVar49 = protobuf::MessageLite::GetArena(pMVar45);
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa21d;
        FStack_208.table = (TcParseTableBase *)Arena::Create<absl::lts_20250127::Cord>(pAVar49);
        uVar7._0_2_ = table_local->has_bits_offset;
        uVar7._2_2_ = table_local->extension_offset;
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa249;
        aStack_1a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)FStack_208;
        ppCVar43 = RefAt<absl::lts_20250127::Cord*>(pMVar45,(ulong)uVar7);
        *ppCVar43 = (Cord *)FStack_208;
      }
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa2b0;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           InlineCordParser((Cord *)aStack_1a8,(char *)param_3_local.field_0,
                            (ParseContext *)msg_local);
      if (param_3_local.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa2e4;
        bVar29 = MpVerifyUtf8((Cord *)aStack_1a8,(TcParseTableBase *)ptr_local,
                              (FieldEntry *)table_local,uStack_158._6_2_);
        uStack_158._0_2_ = CONCAT11(bVar29,(undefined1)uStack_158);
      }
    }
    else {
      if (uStack_158._4_2_ != 0x140) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa2ff;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      uVar6._0_2_ = table_local->has_bits_offset;
      uVar6._2_2_ = table_local->extension_offset;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa12e;
      aStack_190 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   RefAt<google::protobuf::internal::MicroString>((void *)local_160,(ulong)uVar6);
      if ((uStack_158 & 0x10000) != 0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa14a;
        MicroString::InitDefault((MicroString *)aStack_190);
      }
      uStack_200 = (ParseContext *)msg_local;
      aStack_1f8 = param_3_local.field_0;
      aStack_1f0 = aStack_190;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa180;
      pAVar49 = protobuf::MessageLite::GetArena(pMVar45);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa19d;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           EpsCopyInputStream::ReadMicroString
                     (&uStack_200->super_EpsCopyInputStream,(char *)aStack_1f8,
                      (MicroString *)aStack_1f0,pAVar49);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa1b0;
      _aStack_1a0 = MicroString::Get((MicroString *)aStack_190);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa1ea;
      wire_bytes_00._M_str = ptr_local;
      wire_bytes_00._M_len = (size_t)aStack_198;
      bVar29 = MpVerifyUtf8((TcParser *)aStack_1a0,wire_bytes_00,table_local,
                            (FieldEntry *)(uStack_158 >> 0x30),uVar55);
      uStack_158._0_2_ = CONCAT11(bVar29,(undefined1)uStack_158);
    }
    aStack_210._7_1_ = 1;
    if (param_3_local.field_0 != 0) {
      aStack_210._7_1_ = uStack_158._1_1_ ^ 0xff;
    }
    if ((aStack_210._7_1_ & 1) == 0) {
      aStack_240 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
      aStack_238 = param_3_local.field_0;
      aStack_230 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa3ce;
      TcFieldData::TcFieldData((TcFieldData *)&uStack_1c0);
      local_b8 = uStack_1c0;
      local_c0.data = aStack_240.data;
      local_c8 = aStack_238;
      local_d0 = aStack_230;
      aStack_d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
      aStack_e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx_local;
      entry = (FieldEntry *)((ulong)entry & 0xffffffffffffff);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa43c;
      bVar29 = EpsCopyInputStream::DataAvailable
                         ((EpsCopyInputStream *)aStack_230,(char *)aStack_238);
      if (!bVar29) {
        aStack_258.data = local_c0.data;
        aStack_250 = local_c8;
        aStack_248 = local_d0;
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa47a;
        TcFieldData::TcFieldData((TcFieldData *)&local_f0);
        local_30 = local_f0;
        aStack_38 = aStack_258;
        local_40 = aStack_250;
        aStack_48 = aStack_248;
        local_50.data = aStack_d8.data;
        local_58.data = aStack_e0.data;
        local_10 = aStack_258;
        aStack_18.data = aStack_e0.data;
        local_20 = aStack_d8;
        aStack_28.data._4_2_ = ((TcParseTableBase *)aStack_d8.data)->has_bits_offset;
        aStack_28.data._6_2_ = 0;
        aVar47 = aStack_28;
        aStack_28.data._6_2_ = 0;
        if (aStack_28._4_4_ != 0) {
          aStack_260.data._4_4_ = (undefined4)aStack_e0.data;
          uVar53 = (ulong)(uint)aStack_28._4_4_;
          aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa4fc;
          aStack_28 = aVar47;
          puVar51 = RefAt<unsigned_int>((void *)aStack_258,uVar53);
          *puVar51 = aStack_260._4_4_ | *puVar51;
        }
        return (char *)local_40.data;
      }
      aStack_278.data = local_c0.data;
      aStack_270 = local_c8;
      aStack_268 = local_d0;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa549;
      TcFieldData::TcFieldData((TcFieldData *)&entry_offset);
      local_60.data = entry_offset;
      local_68 = aStack_278;
      local_70 = aStack_270;
      local_78 = aStack_268;
      local_80 = aStack_d8;
      local_88 = aStack_e0.data;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa594;
      uVar32 = UnalignedLoad<unsigned_short>((char *)aStack_270);
      local_98 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 (long)(int)((uint)uVar32 & (uint)*(uint8_t *)((long)local_80 + 8));
      local_90._6_2_ = uVar32;
      if ((local_98.data & 7) != 0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa5de;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa5f2;
      res = (uint64_t)TcParseTableBase::fast_entry(local_80.data,local_98.data >> 3);
      local_a8.data = (((FastFieldEntry *)res)->bits).field_0.data ^ (ulong)local_90._6_2_;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa631;
      UNRECOVERED_JUMPTABLE_00 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)res);
      local_b0 = local_a8.data;
      pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                          ((MessageLite *)local_68,(char *)local_70,(ParseContext *)local_78,
                           (TcFieldData)local_a8,(TcParseTableBase *)local_80,local_88);
      return pcVar38;
    }
    aStack_228 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
    aStack_220 = param_3_local.field_0;
    aStack_218 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa361;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_1b0);
    pcVar38 = Error((MessageLite *)aStack_228,(char *)aStack_220,(ParseContext *)aStack_218,
                    (TcFieldData)aStack_1b0,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
    return pcVar38;
  case (undefined *)0x1aab0f0:
    aStack_2e8.data = local_b8;
    aStack_2f0.data = local_c0.data;
    aStack_2f8 = local_c8;
    aStack_300.data = local_d0.data;
    aStack_308.data = aStack_d8.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&aStack_2e0);
    aStack_310.data =
         (uint64_t)
         RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(aVar47.data,(ulong)uVar35);
    pFStack_318 = TcParseTableBase::field_aux
                            ((TcParseTableBase *)aStack_300,(FieldEntry *)aStack_310);
    iVar33 = (pFStack_318->enum_range).first;
    uStack_31d = (undefined1)iVar33;
    uStack_31c = (ushort)((uint)iVar33 >> 8);
    uStack_31a = (undefined1)((uint)iVar33 >> 0x18);
    bStack_319 = (byte)(pFStack_318->enum_range).last;
    bStack_452 = true;
    if ((bStack_319 & 1) != 0) {
      uVar35 = TcFieldData::tag((TcFieldData *)&aStack_2e0);
      bStack_452 = (uVar35 & 7) != 2;
    }
    if (bStack_452) {
      aStack_328.data = aStack_2e0.data;
      pcVar38 = MpFallback((MessageLite *)aStack_2e8,(char *)aStack_2f0,(ParseContext *)aStack_2f8,
                           (TcFieldData)aStack_2e0,(TcParseTableBase *)aStack_300,aStack_308.data);
      return pcVar38;
    }
    aStack_330.data = (uint64_t)MaybeGetSplitBase(aStack_2e8.data,false,aStack_300.data);
    if ((bStack_319 >> 1 & 1) == 0) {
      pMVar46 = RefAt<google::protobuf::internal::MapFieldBaseForParse>
                          ((void *)aStack_330,(ulong)*(uint *)aStack_310);
      pTStack_468 = (TcParseTableBase *)MapFieldBaseForParse::MutableMap(pMVar46);
    }
    else {
      pTStack_468 = (TcParseTableBase *)
                    RefAt<google::protobuf::internal::UntypedMapBase>
                              ((void *)aStack_330,(ulong)*(uint *)aStack_310);
    }
    uStack_338 = pTStack_468;
    aStack_340.data._4_4_ = TcFieldData::tag((TcFieldData *)&aStack_2e0);
    do {
      aVar47 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               UntypedMapBase::AllocNode((UntypedMapBase *)uStack_338);
      aStack_348 = aVar47;
      TStack_354 = UntypedMapBase::type_info((UntypedMapBase *)uStack_338);
      aStack_350.data = aVar47.data + (long)(int)((uint)TStack_354 & 0xffff);
      aStack_360 = (anon_struct_8_2_e5911a21_for_enum_range)
                   NodeBase::GetVoidKey((NodeBase *)aStack_348);
      uStack_370 = absl::lts_20250127::log_internal::GetReferenceableValue
                             (aStack_350.data - (long)aStack_360);
      pvStack_378 = (void *)absl::lts_20250127::log_internal::GetReferenceableValue(8);
      aStack_368 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   absl::lts_20250127::log_internal::Check_GEImpl<long,unsigned_long>
                             (&uStack_370,(unsigned_long *)&pvStack_378,
                              "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
      pTVar20 = uStack_338;
      aVar47 = aStack_348;
      if ((Nullable<const_char_*>)aStack_368.data != (Nullable<const_char_*>)0x0) {
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)aStack_368);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)(auStack_398 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0xb2c,pcVar38);
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)(auStack_398 + 8));
        absl::lts_20250127::log_internal::Voidify::operator&&
                  ((Voidify *)((long)&uStack_380 + 7),pLVar48);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)(auStack_398 + 8));
      }
      *(undefined8 *)aStack_360 = 0;
      *(undefined8 *)(aStack_350.data - 8) = 0;
      aStack_3a0.data = (uint64_t)uStack_338;
      absl::lts_20250127::
      Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2866:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2870:19)>
      ::Overload((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                  *)auStack_398,uStack_338);
      UntypedMapBase::
      VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>
                ((UntypedMapBase *)pTVar20,(NodeBase *)aVar47,
                 (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                  )auStack_398._0_8_);
      pTVar20 = uStack_338;
      aVar47 = aStack_348;
      pTStack_3c8 = uStack_338;
      uStack_3d0 = uStack_338;
      uStack_3d8 = &pFStack_318;
      absl::lts_20250127::
      Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2875:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2878:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2882:19)>
      ::Overload((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                  *)&aStack_3c0,uStack_338,&pFStack_318,uStack_338);
      f.super_anon_class_16_2_4417ab01.aux = (FieldAux **)aStack_3b8;
      f.super_anon_class_8_1_ba1d60bc.map = (UntypedMapBase *)aStack_3c0.data;
      f.super_anon_class_16_2_4417ab01.map = (UntypedMapBase *)pTStack_3b0;
      UntypedMapBase::
      VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>
                ((UntypedMapBase *)pTVar20,(NodeBase *)aVar47,f);
      aVar47 = aStack_2f8;
      paStack_410 = &aStack_348;
      aStack_408.data = (uint64_t)&aStack_2f8;
      uStack_3f8 = &aStack_300;
      aStack_3f0 = aStack_310;
      pTStack_3e8 = uStack_338;
      local_60.data = aStack_2f8.data;
      local_68 = aStack_2f0;
      local_70.data = (uint64_t)&paStack_410;
      aStack_400 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&pFStack_318;
      EpsCopyInputStream::LimitToken::LimitToken((LimitToken *)((long)&local_78 + 4U));
      aStack_28.data = aVar47.data;
      local_30 = local_68;
      aStack_38.data = (long)&local_78 + 4U;
      uVar35 = ReadSize((char **)&local_30);
      local_40.data._4_4_ = uVar35;
      if (((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_30.data ==
           (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) || (*(int *)(aVar47.data + 0x58) < 1))
      {
        local_20.data = 0;
      }
      else {
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&local_40,(char *)aVar47,(int)local_30.data);
        EpsCopyInputStream::LimitToken::operator=((LimitToken *)aStack_38,(LimitToken *)&local_40);
        EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)&local_40);
        *(int *)(aVar47.data + 0x58) = *(int *)(aVar47.data + 0x58) + -1;
        local_20.data = local_30.data;
      }
      local_68.data = local_20.data;
      if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_20.data ==
          (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        local_58.data = local_20.data;
        local_88._0_4_ = 1;
      }
      else {
        local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                   CONCAT44(*(undefined4 *)(aVar47.data + 0x58),(undefined4)local_90);
        local_10.data = local_70.data;
        aStack_18.data = local_20.data;
        local_68.data =
             (uint64_t)
             ParseOneMapEntry(*(NodeBase **)*local_70.data,local_20.data,
                              *(ParseContext **)
                               *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 8),
                              *(FieldAux **)
                               *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 0x10),
                              *(TcParseTableBase **)
                               *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 0x18),
                              *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 0x20),
                              *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 0x28));
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_68.data !=
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue(local_90._4_4_);
          iVar37 = absl::lts_20250127::log_internal::GetReferenceableValue
                             (*(int *)(aVar47.data + 0x58));
          local_98 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     absl::lts_20250127::log_internal::Check_EQImpl
                               (iVar36,iVar37,"old_depth == depth_");
          if ((Nullable<const_char_*>)local_98.data != (Nullable<const_char_*>)0x0) {
            pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                                ((type_identity_t<const_char_*>)local_98);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x481,pcVar38);
            pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                ((LogMessage *)&local_b0);
            absl::lts_20250127::log_internal::Voidify::operator&&
                      ((Voidify *)((long)&res + 7),pLVar48);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_b0);
          }
          local_98.data = 0;
        }
        *(int *)(aVar47.data + 0x58) = *(int *)(aVar47.data + 0x58) + 1;
        EpsCopyInputStream::LimitToken::LimitToken
                  ((LimitToken *)((long)&local_b8 + 4),(LimitToken *)((long)&local_78 + 4));
        bVar29 = EpsCopyInputStream::PopLimit
                           ((EpsCopyInputStream *)aVar47,(LimitToken *)((long)&local_b8 + 4));
        EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)((long)&local_b8 + 4));
        if (((bVar29 ^ 0xffU) & 1) == 0) {
          local_58.data = local_68.data;
          local_88._0_4_ = 1;
        }
        else {
          local_58.data = 0;
          local_88._0_4_ = 1;
        }
      }
      EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)((long)&local_78 + 4));
      aStack_2f0.data = local_58.data;
      if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_58.data ==
          (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        pAVar49 = UntypedMapBase::arena((UntypedMapBase *)uStack_338);
        if (pAVar49 == (Arena *)0x0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)uStack_338,(NodeBase *)aStack_348);
        }
        aVar22 = aStack_2e8;
        aVar21 = aStack_2f0;
        aVar47 = aStack_2f8;
        TcFieldData::TcFieldData((TcFieldData *)&aStack_418);
        pcVar38 = Error((MessageLite *)aVar22,(char *)aVar21,(ParseContext *)aVar47,
                        (TcFieldData)aStack_418,(TcParseTableBase *)aStack_300,aStack_308.data);
        return pcVar38;
      }
      bStack_4f9 = 0;
      if ((bStack_319 >> 4 & 1) != 0) {
        piVar50 = UntypedMapBase::GetValue<int>((UntypedMapBase *)uStack_338,(NodeBase *)aStack_348)
        ;
        aVar47 = aStack_e0;
        iVar36 = *piVar50;
        local_c8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pFStack_318[1].table;
        local_c0.data._4_4_ = iVar36;
        uVar30 = (ushort)((uint)*(undefined4 *)local_c8 >> 0x10);
        local_d0.data._4_2_ = uVar30;
        local_d0.data._6_2_ = (short)*(undefined4 *)local_c8;
        aStack_d8.data = (long)iVar36 - (long)(short)*(undefined4 *)local_c8;
        if ((ulong)aStack_d8 < (Arena *)(ulong)uVar30) {
          local_b8._0_4_ = CONCAT13(1,(uint3)local_b8);
        }
        else {
          uVar31 = (ushort)*(uint32_t *)(local_c8 + 4);
          aStack_e0.data._6_2_ = uVar31;
          aStack_d8.data = aStack_d8.data - uVar30;
          if ((ulong)aStack_d8 < (Arena *)(ulong)uVar31) {
            local_b8._0_4_ =
                 CONCAT13((*(uint *)(local_c8 + ((aStack_d8.data >> 5) + 2) * 4) >>
                           ((byte)aStack_d8.data & 0x1f) & 1) == 1,(uint3)local_b8);
          }
          else {
            aStack_e0.data._4_2_ = (undefined2)(*(uint32_t *)(local_c8 + 4) >> 0x10);
            aStack_e0.data._0_4_ = (undefined4)aVar47.data;
            local_c8 = local_c8 + (long)(int)((*(uint32_t *)(local_c8 + 4) & 0xffff) / 0x20 + 2) * 4
            ;
            for (entry = (FieldEntry *)0x0;
                entry < (FieldEntry *)(ulong)(ushort)aStack_e0.data._4_2_;
                entry = (FieldEntry *)((long)entry * 2 + (long)iVar52)) {
              iVar37 = *(int *)(local_c8 + (long)entry * 4);
              local_f0.data._4_4_ = iVar37;
              if (iVar37 == iVar36) {
                local_b8._0_4_ = CONCAT13(1,(uint3)local_b8);
                goto LAB_01aabad5;
              }
              iVar52 = 2;
              if (iVar36 < iVar37) {
                iVar52 = 1;
              }
            }
            local_b8._0_4_ = (uint)(uint3)local_b8;
          }
        }
LAB_01aabad5:
        bStack_4f9 = local_b8._3_1_ ^ 0xff;
      }
      if ((bStack_4f9 & 1) == 0) {
        TStack_42c = UntypedMapBase::type_info((UntypedMapBase *)uStack_338);
        TVar28 = UntypedMapBase::TypeInfo::key_type_kind(&TStack_42c);
        switch(TVar28) {
        case kBool:
          KeyMapBase<bool>::InsertOrReplaceNode
                    ((KeyMapBase<bool> *)uStack_338,(KeyNode *)aStack_348);
          break;
        case kU32:
          KeyMapBase<unsigned_int>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_int> *)uStack_338,(KeyNode *)aStack_348);
          break;
        case kU64:
          KeyMapBase<unsigned_long>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_long> *)uStack_338,(KeyNode *)aStack_348);
          break;
        default:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb68);
        case kString:
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InsertOrReplaceNode
                    ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)uStack_338,(KeyNode *)aStack_348);
        }
      }
      else {
        aStack_420.data._4_1_ = bStack_319;
        aStack_420.data._0_4_ = CONCAT13(uStack_31a,CONCAT21(uStack_31c,uStack_31d));
        uStack_428 = (MessageLite *)
                     CONCAT44(CONCAT31(uStack_428._5_3_,bStack_319),aStack_420.data._0_4_);
        WriteMapEntryAsUnknown
                  ((MessageLite *)aStack_2e8,(TcParseTableBase *)aStack_300,
                   (UntypedMapBase *)uStack_338,aStack_340._4_4_,(NodeBase *)aStack_348,
                   (MapAuxInfo)
                   ((uint5)(uint)aStack_420.data._0_4_ |
                   (uint5)CONCAT31(uStack_428._5_3_,bStack_319) << 0x20));
      }
      bVar29 = EpsCopyInputStream::DataAvailable
                         ((EpsCopyInputStream *)aStack_2f8,(char *)aStack_2f0);
      uStack_1c0 = aStack_2e8;
      aVar21 = aStack_2f0;
      aVar47 = aStack_2f8;
      if (((bVar29 ^ 0xffU) & 1) != 0) {
        TcFieldData::TcFieldData((TcFieldData *)&aStack_438);
        aStack_1b8 = aStack_438;
        aStack_1c8.data = aVar21.data;
        aStack_1d0 = aVar47;
        uStack_1d8 = aStack_300.data;
        aStack_1e0.data = aStack_308.data;
        aStack_198.data = uStack_1c0;
        aStack_1a0.data = aStack_308.data;
        aStack_1a8.data = aStack_300.data;
        aStack_1b0.data._4_2_ = *(ushort *)aStack_300;
        aStack_1b0.data._6_2_ = 0;
        aVar47 = aStack_1b0;
        aStack_1b0.data._6_2_ = 0;
        if (aStack_1b0.data._4_4_ != 0) {
          uVar34 = (uint)aStack_308.data;
          uVar53 = (ulong)(uint)aStack_1b0.data._4_4_;
          aStack_1b0 = aVar47;
          puVar51 = RefAt<unsigned_int>((void *)uStack_1c0,uVar53);
          *puVar51 = uVar34 | *puVar51;
        }
        return (char *)aStack_1c8.data;
      }
      local_188._8_8_ = aStack_2f0;
      local_188._0_8_ = &aStack_440;
      aStack_190 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)(int)(uint)*(byte *)aStack_2f0;
      if (aStack_190.data < (Arena *)0x80) {
        aStack_440._0_4_ = (uint)*(byte *)aStack_2f0;
        local_178.data = aStack_2f0.data + 1;
      }
      else {
        hasbits_local = aStack_2f0.data + 1;
        uVar18 = (uint7)((aStack_190.data << 0x39) >> 8);
        table_local._1_7_ = uVar18;
        table_local._0_1_ = *(byte *)hasbits_local;
        if ((*(byte *)hasbits_local & 0x80) == 0) {
          _uStack_100 = (Nullable<const_char_*>)CONCAT44(7,uStack_100);
          aStack_440._0_4_ = (int)table_local << 7 | (uint)((aStack_190.data << 0x39) >> 0x39);
          local_178.data = aStack_2f0.data + 2;
          aStack_190 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_local;
          entry_offset = (uint64_t)table_local;
        }
        else {
          local_150.data = aStack_2f0.data + 2;
          local_148._1_7_ = uVar18 >> 7 | (uint7)((ulong)((long)table_local << 0x39) >> 8);
          local_148.data._0_1_ = *(byte *)local_150;
          if ((*(byte *)local_150 & 0x80) == 0) {
            aStack_440._0_4_ = (int)local_148.data << 0xe | (uint)(local_148._1_7_ >> 0x2a);
            local_178.data = aStack_2f0.data + 3;
            aStack_190 = local_148;
            parse_fn = (TailCallParseFunc)local_148;
          }
          else {
            local_160.data = aStack_2f0.data + 3;
            uStack_158._1_7_ = local_148._1_7_ >> 7 | (uint7)((local_148.data << 0x39) >> 8);
            uStack_158._0_1_ = *(byte *)local_160;
            if ((*(byte *)local_160 & 0x80) == 0) {
              msg_local = (MessageLite *)CONCAT44(0x15,msg_local._0_4_);
              aStack_440._0_4_ = (int)uStack_158 << 0x15 | (uint)(uStack_158._1_7_ >> 0x23);
              local_178.data = aStack_2f0.data + 4;
              aStack_190 = uStack_158;
              param_3_local.field_0 = uStack_158;
            }
            else {
              local_170 = (char **)(aStack_2f0.data + 4);
              local_168._1_7_ = uStack_158._1_7_ >> 7 | (uint7)((uStack_158 << 0x39) >> 8);
              bVar27 = (byte)((ThreadSafeArena *)&((MessageLite *)local_170)->_vptr_MessageLite)->
                             tag_and_id_;
              local_168._0_1_ = bVar27;
              aStack_190 = local_168;
              if ((bVar27 & 0x80) == 0) {
                ctx_local = (ParseContext *)CONCAT44(0x1c,ctx_local._0_4_);
                aStack_440._0_4_ = (int)local_168 << 0x1c | (uint)(local_168._1_7_ >> 0x1c);
                local_178.data = aStack_2f0.data + 5;
                ptr_local = (char *)local_168;
              }
              else {
                aStack_440._0_4_ = 0;
                local_178.data = 0;
              }
            }
          }
        }
      }
      aStack_448.data = local_178.data;
      if (aStack_440._0_4_ != aStack_340._4_4_) {
        TcFieldData::TcFieldData((TcFieldData *)&aStack_450);
        aStack_290 = aStack_450;
        aStack_298.data = uStack_1c0;
        aStack_2a0.data = aVar21.data;
        aStack_2a8 = aVar47;
        aStack_2b0.data = aStack_300.data;
        aStack_2b8.data = aStack_308.data;
        aStack_2c0.data = aStack_2c0.data & 0xffffffffffffff;
        bVar29 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)aVar47,(char *)aVar21);
        aStack_210 = aStack_298;
        aVar21 = aStack_2a0;
        aVar47 = aStack_2a8;
        if (!bVar29) {
          TcFieldData::TcFieldData(&TStack_2c8);
          aStack_218.data = aVar21.data;
          aStack_220 = aVar47;
          aStack_228.data = aStack_2b0.data;
          aStack_230.data = aStack_2b8.data;
          uStack_1e8 = aStack_210.data;
          aStack_1f0.data = aStack_2b8.data;
          aStack_1f8.data = aStack_2b0.data;
          uStack_200 = (ParseContext *)(ulong)CONCAT24(*(ushort *)aStack_2b0,(int)uStack_200);
          uVar53 = (ulong)uStack_200;
          uStack_200._4_4_ = (uint)*(ushort *)aStack_2b0;
          if (uStack_200._4_4_ != 0) {
            uVar34 = (uint)aStack_2b8.data;
            uVar54 = (ulong)uStack_200._4_4_;
            uStack_200 = (ParseContext *)uVar53;
            puVar51 = RefAt<unsigned_int>((void *)aStack_210,uVar54);
            *puVar51 = uVar34 | *puVar51;
          }
          return (char *)aStack_218.data;
        }
        TcFieldData::TcFieldData((TcFieldData *)&aStack_2d0);
        aStack_238 = aStack_2d0;
        aStack_240.data = aStack_210.data;
        aStack_248.data = aVar21.data;
        aStack_250 = aVar47;
        aStack_258.data = aStack_2b0.data;
        aStack_260.data = aStack_2b8.data;
        uVar32 = UnalignedLoad<unsigned_short>((char *)aVar21);
        aStack_270 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (long)(int)((uint)uVar32 & (uint)*(uint8_t *)(aStack_258.data + 8));
        aStack_268.data._6_2_ = uVar32;
        if ((aStack_270.data & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        aStack_278.data =
             (uint64_t)TcParseTableBase::fast_entry(aStack_258.data,aStack_270.data >> 3);
        aStack_280.data =
             (((FastFieldEntry *)aStack_278.data)->bits).field_0.data ^
             (ulong)(ushort)aStack_268._6_2_;
        UNRECOVERED_JUMPTABLE_00 =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)aStack_278);
        aStack_288.data = aStack_280.data;
        pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                            ((MessageLite *)aStack_240,(char *)aStack_248,(ParseContext *)aStack_250
                             ,(TcFieldData)aStack_280,(TcParseTableBase *)aStack_258,aStack_260.data
                            );
        return pcVar38;
      }
      aStack_2f0.data = local_178.data;
    } while( true );
  case (undefined *)0x1aac450:
    aStack_2f0 = local_b8;
    aStack_2f8.data = local_c0.data;
    aStack_300 = local_c8;
    aStack_308 = local_d0;
    aStack_310.data = aStack_d8.data;
    pTStack_3b0 = (TcParseTableBase *)local_d0;
    aStack_450.data = 0x1aac49f;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&aStack_2e8);
    aStack_450.data = 0x1aac4af;
    pFStack_318 = (FieldAux *)
                  RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                            (pTStack_3b0,(ulong)uVar35);
    uStack_31c = *(uint16_t *)((long)pFStack_318 + 10);
    uStack_31a = (undefined1)uStack_31c;
    bStack_319 = (byte)(uStack_31c >> 8);
    uStack_31c = uStack_31c & 0x30;
    if (uStack_31c == 0x20) {
      aStack_328.data = aStack_2e8.data;
      pcVar38 = MpRepeatedVarint<true>
                          ((MessageLite *)aStack_2f0,(char *)aStack_2f8,(ParseContext *)aStack_300,
                           (TcFieldData)aStack_2e8,(TcParseTableBase *)aStack_308,aStack_310.data);
      return pcVar38;
    }
    aStack_450.data = 0x1aac536;
    uVar35 = TcFieldData::tag((TcFieldData *)&aStack_2e8);
    if ((uVar35 & 7) != 0) {
      aStack_330.data = aStack_2e8.data;
      pcVar38 = (**(TailCallParseFunc *)((long)aStack_308 + 0x30))
                          ((MessageLite *)aStack_2f0,(char *)aStack_2f8,(ParseContext *)aStack_300,
                           (TcFieldData)aStack_2e8,(TcParseTableBase *)aStack_308,aStack_310.data);
      return pcVar38;
    }
    uStack_338 = (TcParseTableBase *)
                 (CONCAT26(CONCAT11(bStack_319,uStack_31a),(undefined6)uStack_338) &
                 0x600ffffffffffff);
    uStack_338._0_5_ = CONCAT14((bStack_319 & 4) != 0,(undefined4)uStack_338);
    uStack_338 = (TcParseTableBase *)
                 CONCAT35(CONCAT21(uStack_338._6_2_,uStack_338._6_2_ == 0x200),
                          (undefined5)uStack_338);
    aStack_340 = aStack_2f8;
    aStack_280 = aStack_2f8;
    aStack_288.data = (uint64_t)&aStack_348;
    uStack_158 = aStack_2f8;
    local_160.data = (uint64_t)&aStack_290;
    local_168._0_7_ = (uint7)local_168 & 0xffffffffffff;
    local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)CONCAT17(1,(uint7)local_168);
    local_170 = (char **)&uStack_158;
    local_178.data = (uint64_t)&uStack_158;
    aStack_450.data = 0x1aac64b;
    iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                       ((anon_class_8_1_54a39810 *)&local_170);
    *(long *)local_160 = (long)iVar26;
    if ((long)*(ulong *)local_160 < 0) {
      aStack_450.data = 0x1aac685;
      iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                         ((anon_class_8_1_54a39810 *)&local_170);
      hasbits_local = *local_160.data;
      table_local = (TcParseTableBase *)CONCAT17(iVar26,table_local._0_7_);
      local_148.data = (long)local_188 + 8;
      aStack_e0.data._7_1_ = iVar26;
      local_188._8_8_ = (long)iVar26 << 7 | hasbits_local >> 0x39;
      entry = (FieldEntry *)hasbits_local;
      if ((long)local_188._8_8_ < 0) {
        aStack_450.data = 0x1aac708;
        iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                           ((anon_class_8_1_54a39810 *)&local_170);
        ptr_local = *(char **)local_160;
        msg_local = (MessageLite *)CONCAT17(iVar26,msg_local._0_7_);
        local_d0.data._7_1_ = iVar26;
        local_188._0_8_ = (long)iVar26 << 0xe | (ulong)ptr_local >> 0x32;
        ctx_local = (ParseContext *)local_188;
        aStack_d8.data = (uint64_t)ptr_local;
        if ((long)local_188._0_8_ < 0) {
          aStack_450.data = 0x1aac78b;
          ctx_local = (ParseContext *)local_188;
          iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                             ((anon_class_8_1_54a39810 *)&local_170);
          local_c8 = *local_160.data;
          parse_fn = (TailCallParseFunc)CONCAT17(iVar26,parse_fn._0_7_);
          param_3_local.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)local_188 + 8);
          local_c0.data._7_1_ = iVar26;
          local_188._8_8_ = ((long)iVar26 << 0x15 | local_c8 >> 0x2b) & local_188._8_8_;
          if ((long)local_188._8_8_ < 0) {
            aStack_450.data = 0x1aac811;
            iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                               ((anon_class_8_1_54a39810 *)&local_170);
            entry_offset = *local_160.data;
            local_f0.data._7_1_ = iVar26;
            local_b0._7_1_ = iVar26;
            local_188._0_8_ = ((long)iVar26 << 0x1c | entry_offset >> 0x24) & local_188._0_8_;
            _uStack_100 = local_188;
            local_b8 = entry_offset;
            if ((long)local_188._0_8_ < 0) {
              aStack_450.data = 0x1aac897;
              _uStack_100 = local_188;
              iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 ((anon_class_8_1_54a39810 *)&local_170);
              res = *local_160.data;
              local_98.data._7_1_ = iVar26;
              local_a8.data = (long)local_188 + 8;
              local_40.data._7_1_ = iVar26;
              local_188._8_8_ = ((long)iVar26 << 0x23 | res >> 0x1d) & local_188._8_8_;
              aStack_48.data = res;
              if ((long)local_188._8_8_ < 0) {
                aStack_450.data = 0x1aac911;
                iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   ((anon_class_8_1_54a39810 *)&local_170);
                local_88 = *local_160.data;
                local_80.data._7_1_ = iVar26;
                local_30.data._7_1_ = iVar26;
                local_188._0_8_ = ((long)iVar26 << 0x2a | local_88 >> 0x16) & local_188._0_8_;
                local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_188;
                aStack_38.data = local_88;
                if ((long)local_188._0_8_ < 0) {
                  aStack_450.data = 0x1aac97f;
                  local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_188;
                  iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()((anon_class_8_1_54a39810 *)&local_170);
                  local_70.data = *local_160.data;
                  local_68.data._7_1_ = iVar26;
                  local_78 = (uint64_t)(local_188 + 8);
                  local_20.data._7_1_ = iVar26;
                  local_188._8_8_ = ((long)iVar26 << 0x31 | local_70.data >> 0xf) & local_188._8_8_;
                  aStack_28.data = local_70.data;
                  if ((long)local_188._8_8_ < 0) {
                    aStack_450.data = 0x1aac9e4;
                    iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()((anon_class_8_1_54a39810 *)&local_170);
                    local_58.data = *local_160.data;
                    local_50.data._7_1_ = iVar26;
                    local_10.data._7_1_ = iVar26;
                    local_188._0_8_ = ((long)iVar26 << 0x38 | local_58.data >> 8) & local_188._0_8_;
                    local_60.data = (uint64_t)local_188;
                    aStack_18.data = local_58.data;
                    if ((long)local_188._0_8_ < 0) {
                      aStack_450.data = 0x1aaca46;
                      local_60.data = (uint64_t)local_188;
                      iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                               operator()((anon_class_8_1_54a39810 *)&local_170);
                      if (iVar26 != '\x01') {
                        aStack_450.data = 0x1aaca5c;
                        iVar26 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                 operator()((anon_class_8_1_54a39810 *)&local_178);
                        if (((int)iVar26 & 0x80U) != 0) {
                          local_150.data = 0;
                          goto LAB_01aacb05;
                        }
                        aStack_450.data = 0x1aaca85;
                        bVar27 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                 operator()((anon_class_8_1_54a39810 *)&local_178);
                        if ((bVar27 & 1) == 0) {
                          local_188._0_8_ = local_188._0_8_ ^ 0x8000000000000000;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_188._8_8_ = local_188._0_8_ & local_188._8_8_;
      }
      *(ulong *)local_160 = local_188._8_8_ & *(ulong *)local_160;
      if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)uStack_158 ==
          (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        aStack_450.data = 0x1aacaf0;
        protobuf_assumption_failed
                  ("p != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/varint_shuffle.h"
                   ,0x91);
      }
      local_150.data = uStack_158;
    }
    else {
      local_150.data = uStack_158;
    }
LAB_01aacb05:
    aStack_280 = local_150;
    *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_288 = aStack_290;
    aStack_2f8.data = aStack_280.data;
    if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_280.data ==
        (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
      pTStack_3c8 = (TcParseTableBase *)aStack_2f0;
      aStack_3c0.data = aStack_280.data;
      aStack_3b8 = aStack_300;
      aStack_450.data = 0x1aacb72;
      TcFieldData::TcFieldData((TcFieldData *)&aStack_350);
      pcVar38 = Error((MessageLite *)pTStack_3c8,(char *)aStack_3c0,(ParseContext *)aStack_3b8,
                      (TcFieldData)aStack_350,(TcParseTableBase *)aStack_308,aStack_310.data);
      return pcVar38;
    }
    TStack_354 = (TypeInfo)(CONCAT22(TStack_354._2_2_,CONCAT11(bStack_319,uStack_31a)) & 0xffff01c0)
    ;
    if (TStack_354.node_size == 0xc0) {
      if (((ulong)uStack_338 & 0x10000000000) != 0) {
        aStack_450.data = 0x1aacbdf;
        aStack_348.data = WireFormatLite::ZigZagDecode64(aStack_348.data);
      }
    }
    else if (TStack_354.node_size == 0x80) {
      if (((ulong)uStack_338 & 0x100000000) == 0) {
        if (((ulong)uStack_338 & 0x10000000000) != 0) {
          aStack_450.data = 0x1aacd45;
          iVar33 = WireFormatLite::ZigZagDecode32((uint32_t)aStack_348.data);
          aStack_348 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar33;
        }
      }
      else {
        uStack_3d0 = (TcParseTableBase *)CONCAT44(uStack_3d0._4_4_,(uint32_t)aStack_348.data);
        uStack_3d0 = (TcParseTableBase *)CONCAT26(uStack_338._6_2_,(undefined6)uStack_3d0);
        aStack_450.data = 0x1aacc38;
        pFVar44 = TcParseTableBase::field_aux
                            ((TcParseTableBase *)aStack_308,(FieldEntry *)&pFStack_318->enum_range);
        aStack_360 = pFVar44->enum_range;
        aStack_1d0.data._2_2_ = uStack_3d0._6_2_;
        aStack_1d0.data._4_4_ = (int)uStack_3d0;
        aStack_1c8._0_4_ = aStack_360.first;
        aStack_1c8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)aStack_360;
        if (uStack_3d0._6_2_ == 0x600) {
          uVar19 = (undefined7)uStack_3d8;
          uStack_3d8 = (FieldAux **)((ulong)uStack_3d8 & 0xffffffffffffff);
          if ((int)aStack_1c8._0_4_ <= (int)uStack_3d0) {
            aStack_1c8._4_4_ = aStack_360.last;
            uStack_3d8 = (FieldAux **)CONCAT17((int)uStack_3d0 <= (int)aStack_1c8._4_4_,uVar19);
          }
          uStack_1c0._3_1_ = uStack_3d8._7_1_;
        }
        else {
          aStack_450.data = 0x1aaccc8;
          uVar24 = aStack_1c8._0_4_;
          bVar29 = ValidateEnum((internal *)((ulong)uStack_3d0 & 0xffffffff),uVar24,
                                (uint32_t *)aStack_360);
          uStack_1c0._3_1_ = bVar29;
        }
        if (uStack_1c0._3_1_ == '\0') {
          aStack_2f8 = aStack_340;
          aStack_368 = aStack_2e8;
          pcVar38 = MpUnknownEnumFallback
                              ((MessageLite *)aStack_2f0,(char *)aStack_340,
                               (ParseContext *)aStack_300,(TcFieldData)aStack_2e8,
                               (TcParseTableBase *)aStack_308,aStack_310.data);
          return pcVar38;
        }
      }
    }
    uStack_370 = CONCAT17(uStack_31c == 0x30,(undefined7)uStack_370);
    if (uStack_31c == 0x10) {
      aStack_450.data = 0x1aacd88;
      anon_unknown_104::SetHas((FieldEntry *)&pFStack_318->enum_range,(MessageLite *)aStack_2f0);
    }
    else if (uStack_31c == 0x30) {
      pTStack_3e8 = (TcParseTableBase *)aStack_308;
      pFStack_3e0 = pFStack_318;
      aStack_450.data = 0x1aacdbb;
      uVar35 = TcFieldData::tag((TcFieldData *)&aStack_2e8);
      aStack_450.data = 0x1aacde1;
      ChangeOneof(pTStack_3e8,(FieldEntry *)&pFStack_3e0->enum_range,uVar35 >> 3,
                  (ParseContext *)aStack_300,(MessageLite *)aStack_2f0);
    }
    aStack_450.data = 0x1aacdfb;
    pvStack_378 = MaybeGetSplitBase((MessageLite *)aStack_2f0,true,(TcParseTableBase *)aStack_308);
    if (TStack_354.node_size == 0xc0) {
      aStack_3f0.data = aStack_348.data;
      aStack_450.data = 0x1aace35;
      paVar39 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                RefAt<unsigned_long>(pvStack_378,(ulong)(uint)(pFStack_318->enum_range).first);
      paVar39->data = (uint64_t)aStack_3f0;
    }
    else if (TStack_354.node_size == 0x80) {
      uStack_3f8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                   CONCAT44((int)aStack_348.data,(undefined4)uStack_3f8);
      aStack_450.data = 0x1aace76;
      puVar51 = RefAt<unsigned_int>(pvStack_378,(ulong)(uint)(pFStack_318->enum_range).first);
      *puVar51 = uStack_3f8._4_4_;
    }
    else {
      aStack_450.data = 0x1aace91;
      uStack_382 = absl::lts_20250127::log_internal::GetReferenceableValue(TStack_354.node_size);
      aStack_450.data = 0x1aace9f;
      uStack_384 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      aStack_450.data = 0x1aacec0;
      uStack_380 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                             (&uStack_382,&uStack_384,
                              "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
      if (uStack_380 != (Nullable<const_char_*>)0x0) {
        aStack_450.data = 0x1aacedd;
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>(uStack_380);
        aStack_450.data = 0x1aacef8;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)auStack_398,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,pcVar38);
        aStack_450.data = 0x1aacf04;
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)auStack_398);
        aStack_450.data = 0x1aacf13;
        absl::lts_20250127::log_internal::Voidify::operator&&(&VStack_385,pLVar48);
        aStack_450.data = 0x1aacf1f;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)auStack_398);
      }
      uStack_3f8._0_4_ =
           CONCAT13((FieldEntry *)aStack_348.data != (FieldEntry *)0x0,(undefined3)uStack_3f8);
      aStack_450.data = 0x1aacf47;
      pbVar40 = RefAt<bool>(pvStack_378,(ulong)(uint)(pFStack_318->enum_range).first);
      *pbVar40 = (bool)(uStack_3f8._3_1_ & 1);
    }
    paStack_410 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_2f0;
    aStack_408 = aStack_2f8;
    aStack_400 = aStack_300;
    aStack_450.data = 0x1aacf8a;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_3a0);
    aStack_298 = aStack_3a0;
    aStack_2a0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)paStack_410;
    aStack_2a8 = aStack_408;
    aStack_2b0 = aStack_400;
    aStack_2b8 = aStack_308;
    aStack_2c0 = aStack_310;
    TStack_2c8.field_0.data._7_1_ = 0;
    aStack_450.data = 0x1aacff8;
    bVar29 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)aStack_400,(char *)aStack_408);
    if (!bVar29) {
      uStack_428 = (MessageLite *)aStack_2a0;
      aStack_420 = aStack_2a8;
      aStack_418 = aStack_2b0;
      aStack_450.data = 0x1aad036;
      TcFieldData::TcFieldData((TcFieldData *)&aStack_2d0);
      aStack_1f8 = aStack_2d0;
      uStack_200 = (ParseContext *)uStack_428;
      FStack_208 = (FieldAux)aStack_420;
      aStack_210 = aStack_418;
      aStack_218 = aStack_2b8;
      aStack_220.data = aStack_2c0.data;
      uStack_1d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)uStack_428;
      aStack_1e0.data = aStack_2c0.data;
      uStack_1e8 = aStack_2b8;
      aStack_1f0.data._4_2_ = *(uint16_t *)aStack_2b8;
      aStack_1f0.data._6_2_ = 0;
      aVar47 = aStack_1f0;
      aStack_1f0.data._6_2_ = 0;
      if (aStack_1f0._4_4_ != 0) {
        TStack_42c = SUB84(aStack_2c0.data,0);
        uVar53 = (ulong)(uint)aStack_1f0._4_4_;
        aStack_450.data = 0x1aad0ee;
        aStack_1f0 = aVar47;
        puVar51 = RefAt<unsigned_int>(uStack_428,uVar53);
        *puVar51 = (uint)TStack_42c | *puVar51;
      }
      return (char *)((anon_union_8_1_898a9ca8_for_TcFieldData_0)FStack_208).data;
    }
    aStack_448 = aStack_2a0;
    aStack_440 = aStack_2a8;
    aStack_438 = aStack_2b0;
    aStack_450.data = 0x1aad13e;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_2d8);
    aStack_228 = aStack_2d8;
    aStack_230 = aStack_448;
    aStack_238 = aStack_440;
    aStack_240 = aStack_438;
    aStack_248 = aStack_2b8;
    aStack_250.data = aStack_2c0.data;
    aStack_450.data = 0x1aad19e;
    uVar32 = UnalignedLoad<unsigned_short>((char *)aStack_440);
    aStack_260 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 (long)(int)((uint)uVar32 & (uint)*(uint8_t *)((long)aStack_248 + 8));
    aStack_258.data._6_2_ = uVar32;
    if ((aStack_260.data & 7) != 0) {
      aStack_450.data = 0x1aad1eb;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    aStack_450.data = 0x1aad202;
    aStack_268.data = (uint64_t)TcParseTableBase::fast_entry(aStack_248.data,aStack_260.data >> 3);
    aStack_270.data =
         (((FastFieldEntry *)aStack_268.data)->bits).field_0.data ^ (ulong)(ushort)aStack_258._6_2_;
    aStack_450.data = 0x1aad241;
    UNRECOVERED_JUMPTABLE_00 =
         TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)aStack_268);
    aStack_278.data = aStack_270.data;
    pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                        ((MessageLite *)aStack_230,(char *)aStack_238,(ParseContext *)aStack_240,
                         (TcFieldData)aStack_270,(TcParseTableBase *)aStack_248,aStack_250.data);
    return pcVar38;
  case (undefined *)0x1aad290:
    local_40.data = local_b8;
    aStack_48.data = local_c0.data;
    local_50 = local_c8;
    local_58 = local_d0;
    local_60.data = aStack_d8.data;
    entry = (FieldEntry *)local_d0;
    _uStack_100 = (Nullable<const_char_*>)0x1aad2c7;
    aStack_38.data = aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&aStack_38);
    _uStack_100 = (Nullable<const_char_*>)0x1aad2d7;
    local_68 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(entry,(ulong)uVar35);
    local_70.data._6_2_ = ((FieldEntry *)local_68.data)->type_card;
    _uStack_100 = (Nullable<const_char_*>)0x1aad2f0;
    uVar35 = TcFieldData::tag((TcFieldData *)&aStack_38);
    local_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (CONCAT44(local_70._4_4_,uVar35) & 0xffffffff00000007);
    if (local_70._0_4_ != 2) {
      local_78 = aStack_38.data;
      pcVar38 = MpRepeatedVarint<true>
                          ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                           (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
      return pcVar38;
    }
    local_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (CONCAT26(local_70._6_2_,local_80._0_6_) & 0x600ffffffffffff);
    local_10.data = local_40.data;
    aStack_18.data = local_60.data;
    local_20 = local_58;
    aStack_28.data._4_2_ = *(uint16_t *)local_58;
    aStack_28.data._6_2_ = 0;
    aVar47 = aStack_28;
    aStack_28.data._6_2_ = 0;
    if (aStack_28._4_4_ != 0) {
      local_f0.data._4_4_ = (int)local_60.data;
      uVar53 = (ulong)(uint)aStack_28._4_4_;
      _uStack_100 = (Nullable<const_char_*>)0x1aad376;
      aStack_28 = aVar47;
      puVar51 = RefAt<unsigned_int>((void *)local_40,uVar53);
      *puVar51 = local_f0.data._4_4_ | *puVar51;
      aVar47 = aStack_28;
    }
    aStack_28 = aVar47;
    local_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (CONCAT26(local_80._6_2_,CONCAT24(local_70._6_2_,local_80._0_4_)) &
               0xffff01c0ffffffff);
    uVar34 = CONCAT22(0,(ushort)local_80._4_2_ >> 6);
    local_f0.data._0_4_ = uVar34;
    if ((ushort)local_80._4_2_ >> 6 == 0) {
      aStack_e0.data = aStack_38.data;
      pcVar38 = MpPackedVarintT<true,bool,(unsigned_short)0>
                          ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                           (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
      return pcVar38;
    }
    if (uVar34 == 2) {
      entry_offset = (uint64_t)((ushort)local_80._6_2_ >> 9);
      switch(entry_offset) {
      case 0:
        local_c0.data = aStack_38.data;
        pcVar38 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      case 1:
        local_c8 = aStack_38.data;
        pcVar38 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      case 2:
        local_d0.data = aStack_38.data;
        pcVar38 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      case 3:
        aStack_d8.data = aStack_38.data;
        pcVar38 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      default:
        _uStack_100 = (Nullable<const_char_*>)0x1aad5d7;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x8f2);
      }
    }
    if (uVar34 == 3) {
      if (local_80._6_2_ == 0) {
        local_88 = aStack_38.data;
        pcVar38 = MpPackedVarintT<true,unsigned_long,(unsigned_short)0>
                            ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                             (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
        return pcVar38;
      }
      _uStack_100 = (Nullable<const_char_*>)0x1aad407;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(local_80._6_2_);
      local_98.data._6_2_ = uVar32;
      _uStack_100 = (Nullable<const_char_*>)0x1aad418;
      iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue(0x200);
      local_98.data._0_4_ = iVar36;
      _uStack_100 = (Nullable<const_char_*>)0x1aad438;
      local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                 absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,int>
                           ((unsigned_short *)((long)&local_98 + 6),(int *)&local_98.data,
                            "xform_val == +field_layout::kTvZigZag");
      if (local_90 != (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        _uStack_100 = (Nullable<const_char_*>)0x1aad455;
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)&local_90->data);
        _uStack_100 = (Nullable<const_char_*>)0x1aad470;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x8db,pcVar38);
        _uStack_100 = (Nullable<const_char_*>)0x1aad47c;
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&local_b0);
        _uStack_100 = (Nullable<const_char_*>)0x1aad48b;
        absl::lts_20250127::log_internal::Voidify::operator&&((Voidify *)((long)&res + 7),pLVar48);
        _uStack_100 = (Nullable<const_char_*>)0x1aad497;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      local_b8 = aStack_38;
      pcVar38 = MpPackedVarintT<true,unsigned_long,(unsigned_short)0>
                          ((MessageLite *)local_40,(char *)aStack_48,(ParseContext *)local_50,
                           (TcFieldData)aStack_38,(TcParseTableBase *)local_58,local_60.data);
      return pcVar38;
    }
    _uStack_100 = &UNK_01aad61b;
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0x8f9);
  case (undefined *)0x1aad620:
    param_3_local.field_0 = local_c0;
    msg_local = (MessageLite *)local_c8;
    ptr_local = (char *)local_d0;
    ctx_local = (ParseContext *)aStack_d8;
    aStack_1a0 = local_d0;
    aStack_220.data = 0x1aad66f;
    parse_fn = (TailCallParseFunc)aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&parse_fn);
    aStack_220.data = 0x1aad67f;
    table_local = (TcParseTableBase *)
                  RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                            ((void *)aStack_1a0,(ulong)uVar35);
    hasbits_local =
         CONCAT26(table_local->lookup_table_offset,
                  CONCAT24(table_local->lookup_table_offset,(int)hasbits_local)) &
         0xffff0030ffffffff;
    if (hasbits_local._4_2_ == 0x20) {
      local_148 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
      pcVar38 = MpRepeatedFixed<true>
                          (pMVar45,(char *)param_3_local.field_0,(ParseContext *)msg_local,
                           (TcFieldData)parse_fn,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
      return pcVar38;
    }
    local_150.data = CONCAT26(hasbits_local._6_2_,local_150.data._0_6_) & 0x1c0ffffffffffff;
    aStack_220.data = 0x1aad719;
    uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
    local_150.data = CONCAT44(local_150.data._4_4_,uVar35) & 0xffffffff00000007;
    if (local_150.data._6_2_ == 0xc0) {
      if (local_150.data._0_4_ != 1) {
        uStack_158 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
        pcVar38 = (char *)(**(code **)(ptr_local + 0x30))
                                    (pMVar45,param_3_local.field_0,msg_local,parse_fn,ptr_local,
                                     ctx_local);
        return pcVar38;
      }
    }
    else {
      aStack_220.data = 0x1aad799;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(local_150.data._6_2_);
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)CONCAT26(uVar32,(undefined6)local_168);
      aStack_220.data = 0x1aad7aa;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
      local_168._4_2_ = uVar32;
      aStack_220.data = 0x1aad7cb;
      local_160 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)((long)&local_168 + 6),
                             (unsigned_short *)((long)&local_168 + 4),
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      if ((Nullable<const_char_*>)local_160.data != (Nullable<const_char_*>)0x0) {
        aStack_220.data = 0x1aad7e8;
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)local_160);
        aStack_220.data = 0x1aad803;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_178,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar38);
        aStack_220.data = 0x1aad80f;
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)&local_178);
        aStack_220.data = 0x1aad81e;
        absl::lts_20250127::log_internal::Voidify::operator&&
                  ((Voidify *)((long)&local_168 + 3),pLVar48);
        aStack_220.data = 0x1aad82a;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_178);
      }
      if (local_150.data._0_4_ != 5) {
        local_188._8_8_ = parse_fn;
        pcVar38 = (char *)(**(code **)(ptr_local + 0x30))
                                    (pMVar45,param_3_local.field_0,msg_local,parse_fn,ptr_local,
                                     ctx_local);
        return pcVar38;
      }
      local_160.data = 0;
    }
    if (hasbits_local._4_2_ == 0x10) {
      aStack_220.data = 0x1aad8a1;
      anon_unknown_104::SetHas((FieldEntry *)table_local,pMVar45);
    }
    else if (hasbits_local._4_2_ == 0x30) {
      aStack_1b0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
      aStack_1a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_local;
      aStack_220.data = 0x1aad8d7;
      uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
      aStack_220.data = 0x1aad8fd;
      ChangeOneof((TcParseTableBase *)aStack_1b0,(FieldEntry *)aStack_1a8,uVar35 >> 3,
                  (ParseContext *)msg_local,pMVar45);
    }
    aStack_220.data = 0x1aad917;
    local_188._0_8_ = MaybeGetSplitBase(pMVar45,true,(TcParseTableBase *)ptr_local);
    if (local_150.data._6_2_ == 0xc0) {
      aStack_220.data = 0x1aad938;
      aStack_1b8.data = UnalignedLoad<unsigned_long>(param_3_local.field_0);
      uVar10._0_2_ = table_local->has_bits_offset;
      uVar10._2_2_ = table_local->extension_offset;
      aStack_220.data = 0x1aad956;
      puVar41 = RefAt<unsigned_long>((void *)local_188._0_8_,(ulong)uVar10);
      *puVar41 = (unsigned_long)aStack_1b8;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)param_3_local.field_0 + 8);
    }
    else {
      aStack_220.data = 0x1aad980;
      uVar34 = UnalignedLoad<unsigned_int>((char *)param_3_local.field_0);
      uStack_1c0._4_4_ = uVar34;
      uVar11._0_2_ = table_local->has_bits_offset;
      uVar11._2_2_ = table_local->extension_offset;
      aStack_220.data = 0x1aad99d;
      puVar51 = RefAt<unsigned_int>((void *)local_188._0_8_,(ulong)uVar11);
      *puVar51 = uStack_1c0._4_4_;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)param_3_local.field_0 + 4);
    }
    uStack_1d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
    aStack_1d0 = param_3_local.field_0;
    aStack_1c8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
    aStack_220.data = 0x1aad9ed;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_190);
    local_b8 = aStack_190;
    local_c0.data = uStack_1d8;
    local_c8 = aStack_1d0;
    local_d0 = aStack_1c8;
    aStack_d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
    aStack_e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx_local;
    entry = (FieldEntry *)((ulong)entry & 0xffffffffffffff);
    aStack_220.data = 0x1aada5b;
    bVar29 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)aStack_1c8,(char *)aStack_1d0);
    if (!bVar29) {
      aStack_1f0.data = local_c0.data;
      uStack_1e8 = local_c8;
      aStack_1e0 = local_d0;
      aStack_220.data = 0x1aada99;
      TcFieldData::TcFieldData((TcFieldData *)&local_f0);
      local_30 = local_f0;
      aStack_38 = aStack_1f0;
      local_40 = uStack_1e8;
      aStack_48 = aStack_1e0;
      local_50.data = aStack_d8.data;
      local_58.data = aStack_e0.data;
      local_10 = aStack_1f0;
      aStack_18.data = aStack_e0.data;
      local_20 = aStack_d8;
      aStack_28.data._4_2_ = ((TcParseTableBase *)aStack_d8.data)->has_bits_offset;
      aStack_28.data._6_2_ = 0;
      aVar47 = aStack_28;
      aStack_28.data._6_2_ = 0;
      if (aStack_28._4_4_ != 0) {
        aStack_1f8.data._4_4_ = (undefined4)aStack_e0.data;
        uVar53 = (ulong)(uint)aStack_28._4_4_;
        aStack_220.data = 0x1aadb1b;
        aStack_28 = aVar47;
        puVar51 = RefAt<unsigned_int>((void *)aStack_1f0,uVar53);
        *puVar51 = aStack_1f8._4_4_ | *puVar51;
      }
      return (char *)local_40.data;
    }
    aStack_210.data = local_c0.data;
    FStack_208 = (FieldAux)local_c8;
    uStack_200 = (ParseContext *)local_d0;
    aStack_220.data = 0x1aadb68;
    TcFieldData::TcFieldData((TcFieldData *)&entry_offset);
    local_60.data = entry_offset;
    local_68 = aStack_210;
    local_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)FStack_208;
    local_78 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)uStack_200;
    local_80 = aStack_d8;
    local_88 = aStack_e0.data;
    aStack_220.data = 0x1aadbb3;
    uVar32 = UnalignedLoad<unsigned_short>((char *)FStack_208);
    local_98 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (long)(int)((uint)uVar32 & (uint)*(uint8_t *)((long)local_80 + 8));
    local_90._6_2_ = uVar32;
    if ((local_98.data & 7) != 0) {
      aStack_220.data = 0x1aadbfd;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    aStack_220.data = 0x1aadc11;
    res = (uint64_t)TcParseTableBase::fast_entry(local_80.data,local_98.data >> 3);
    local_a8.data = (((FastFieldEntry *)res)->bits).field_0.data ^ (ulong)local_90._6_2_;
    aStack_220.data = 0x1aadc50;
    UNRECOVERED_JUMPTABLE_00 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)res);
    local_b0 = local_a8.data;
    pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                        ((MessageLite *)local_68,(char *)local_70,(ParseContext *)local_78,
                         (TcFieldData)local_a8,(TcParseTableBase *)local_80,local_88);
    return pcVar38;
  case (undefined *)0x1aadc90:
    param_3_local.field_0 = local_c0;
    msg_local = (MessageLite *)local_c8;
    ptr_local = (char *)local_d0;
    ctx_local = (ParseContext *)aStack_d8;
    aStack_1b0.data = local_d0.data;
    aStack_220.data = 0x1aadcdf;
    parse_fn = (TailCallParseFunc)aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&parse_fn);
    aStack_220.data = 0x1aadcef;
    table_local = (TcParseTableBase *)
                  RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                            ((void *)aStack_1b0,(ulong)uVar35);
    hasbits_local = CONCAT26(table_local->lookup_table_offset,(undefined6)hasbits_local);
    aStack_220.data = 0x1aadd14;
    uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
    hasbits_local = CONCAT44(hasbits_local._4_4_,uVar35) & 0xffffffff00000007;
    if ((int)hasbits_local != 2) {
      local_148 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
      pcVar38 = MpRepeatedFixed<true>
                          (pMVar45,(char *)param_3_local.field_0,(ParseContext *)msg_local,
                           (TcFieldData)parse_fn,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
      return pcVar38;
    }
    aStack_220.data = 0x1aadd83;
    local_150 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                MaybeGetSplitBase(pMVar45,true,(TcParseTableBase *)ptr_local);
    aStack_220.data = 0x1aadd96;
    uVar35 = ReadSize((char **)&param_3_local);
    uStack_158 = CONCAT44(uVar35,CONCAT22(hasbits_local._6_2_,(ushort)uStack_158)) &
                 0xffffffff01c0ffff;
    if (uStack_158._2_2_ == 0xc0) {
      uVar12._0_2_ = table_local->has_bits_offset;
      uVar12._2_2_ = table_local->extension_offset;
      aStack_220.data = 0x1aadddb;
      local_160.data =
           (uint64_t)
           MaybeCreateRepeatedFieldRefAt<unsigned_long,true>(local_150.data,(ulong)uVar12,pMVar45);
      aStack_220.data = 0x1aade02;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                     ((EpsCopyInputStream *)msg_local,(char *)param_3_local.field_0,uStack_158._4_4_
                      ,(RepeatedField<unsigned_long> *)local_160);
    }
    else {
      aStack_220.data = 0x1aade1c;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(uStack_158._2_2_);
      local_170._6_2_ = uVar32;
      aStack_220.data = 0x1aade2d;
      uVar32 = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
      local_170._4_2_ = uVar32;
      aStack_220.data = 0x1aade4e;
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)((long)&local_170 + 6),
                             (unsigned_short *)((long)&local_170 + 4),
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      if ((Arena *)local_168 != (Arena *)0x0) {
        aStack_220.data = 0x1aade6b;
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)local_168);
        aStack_220.data = 0x1aade86;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)(local_188 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar38);
        aStack_220.data = 0x1aade92;
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)(local_188 + 8));
        aStack_220.data = 0x1aadea1;
        absl::lts_20250127::log_internal::Voidify::operator&&
                  ((Voidify *)((long)&local_170 + 3),pLVar48);
        aStack_220.data = 0x1aadead;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)(local_188 + 8));
      }
      uVar13._0_2_ = table_local->has_bits_offset;
      uVar13._2_2_ = table_local->extension_offset;
      aStack_220.data = 0x1aadecb;
      local_188._0_8_ =
           MaybeCreateRepeatedFieldRefAt<unsigned_int,true>((void *)local_150,(ulong)uVar13,pMVar45)
      ;
      aStack_220.data = 0x1aadef2;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                     ((EpsCopyInputStream *)msg_local,(char *)param_3_local.field_0,uStack_158._4_4_
                      ,(RepeatedField<unsigned_int> *)local_188._0_8_);
    }
    if (param_3_local.field_0 == 0) {
      aStack_1c8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
      uStack_1c0 = param_3_local.field_0;
      aStack_1b8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
      aStack_220.data = 0x1aadf39;
      TcFieldData::TcFieldData((TcFieldData *)&aStack_190);
      pcVar38 = Error((MessageLite *)aStack_1c8,(char *)uStack_1c0,(ParseContext *)aStack_1b8,
                      (TcFieldData)aStack_190,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
      return pcVar38;
    }
    aStack_1e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
    uStack_1d8 = param_3_local.field_0;
    aStack_1d0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
    aStack_220.data = 0x1aadfa6;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_1a0);
    local_b8 = aStack_1a0;
    local_c0.data = aStack_1e0.data;
    local_c8 = uStack_1d8;
    local_d0 = aStack_1d0;
    aStack_d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
    aStack_e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx_local;
    entry = (FieldEntry *)((ulong)entry & 0xffffffffffffff);
    aStack_220.data = 0x1aae014;
    bVar29 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)aStack_1d0,(char *)uStack_1d8);
    if (!bVar29) {
      aStack_1f8.data = local_c0.data;
      aStack_1f0 = local_c8;
      uStack_1e8 = local_d0;
      aStack_220.data = 0x1aae052;
      TcFieldData::TcFieldData((TcFieldData *)&local_f0);
      local_30 = local_f0;
      aStack_38 = aStack_1f8;
      local_40 = aStack_1f0;
      aStack_48 = uStack_1e8;
      local_50.data = aStack_d8.data;
      local_58 = aStack_e0;
      local_10 = aStack_1f8;
      aStack_18 = aStack_e0;
      local_20 = aStack_d8;
      aStack_28.data._4_2_ = ((TcParseTableBase *)aStack_d8.data)->has_bits_offset;
      aStack_28.data._6_2_ = 0;
      aVar47 = aStack_28;
      aStack_28.data._6_2_ = 0;
      if (aStack_28._4_4_ != 0) {
        uVar53 = (ulong)(uint)aStack_28._4_4_;
        aStack_220.data = 0x1aae0d4;
        aStack_28 = aVar47;
        puVar51 = RefAt<unsigned_int>((void *)aStack_1f8,uVar53);
        *puVar51 = (uint)((ulong)uStack_200 >> 0x20) | *puVar51;
      }
      return (char *)local_40.data;
    }
    aStack_218.data = local_c0.data;
    aStack_210 = local_c8;
    FStack_208 = (FieldAux)local_d0;
    aStack_220.data = 0x1aae121;
    TcFieldData::TcFieldData((TcFieldData *)&entry_offset);
    local_60.data = entry_offset;
    local_68 = aStack_218;
    local_70 = aStack_210;
    local_78 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)FStack_208;
    local_80 = aStack_d8;
    local_88 = aStack_e0;
    aStack_220.data = 0x1aae16c;
    uVar32 = UnalignedLoad<unsigned_short>((char *)aStack_210);
    local_98 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (long)(int)((uint)uVar32 & (uint)*(uint8_t *)((long)local_80 + 8));
    local_90._6_2_ = uVar32;
    if ((local_98.data & 7) != 0) {
      aStack_220.data = 0x1aae1b6;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    aStack_220.data = 0x1aae1ca;
    res = (uint64_t)TcParseTableBase::fast_entry(local_80.data,local_98.data >> 3);
    local_a8.data = (((FastFieldEntry *)res)->bits).field_0.data ^ (ulong)local_90._6_2_;
    aStack_220.data = 0x1aae209;
    UNRECOVERED_JUMPTABLE_00 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)res);
    local_b0 = local_a8.data;
    pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                        ((MessageLite *)local_68,(char *)local_70,(ParseContext *)local_78,
                         (TcFieldData)local_a8,(TcParseTableBase *)local_80,local_88);
    return pcVar38;
  case (undefined *)0x1aae240:
    param_3_local.field_0 = local_c0;
    msg_local = (MessageLite *)local_c8;
    ptr_local = (char *)local_d0;
    ctx_local = (ParseContext *)aStack_d8;
    aStack_1d0 = local_d0;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae28f;
    aVar47 = aStack_d8;
    parse_fn = (TailCallParseFunc)aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&parse_fn);
    uVar55 = (uint16_t)aVar47.data;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae29f;
    table_local = (TcParseTableBase *)
                  RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                            ((void *)aStack_1d0,(ulong)uVar35);
    hasbits_local =
         CONCAT26(table_local->lookup_table_offset,
                  CONCAT24(table_local->lookup_table_offset,(int)hasbits_local)) &
         0xffff0030ffffffff;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae2d5;
    uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
    hasbits_local = CONCAT44(hasbits_local._4_4_,uVar35) & 0xffffffff00000007;
    if ((int)hasbits_local != 2) {
      local_148 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
      pcVar38 = (char *)(**(code **)(ptr_local + 0x30))
                                  (pMVar45,param_3_local.field_0,msg_local,parse_fn,ptr_local,
                                   ctx_local);
      return pcVar38;
    }
    if (hasbits_local._4_2_ == 0x20) {
      local_150 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)parse_fn;
      pcVar38 = MpRepeatedString<true>
                          (pMVar45,(char *)param_3_local.field_0,(ParseContext *)msg_local,
                           (TcFieldData)parse_fn,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
      return pcVar38;
    }
    uStack_158 = CONCAT26(hasbits_local._6_2_,(undefined6)uStack_158) & 0x600ffffffffffff;
    uStack_158 = CONCAT26(uStack_158._6_2_,CONCAT24(hasbits_local._6_2_,(undefined4)uStack_158)) &
                 0xffff01c0ffffffff;
    uStack_158._0_4_ = CONCAT13(hasbits_local._4_2_ == 0x30,(undefined3)uStack_158);
    uStack_158 = CONCAT53(uStack_158._3_5_,(undefined3)uStack_158) & 0xffffffffff00ffff;
    if (hasbits_local._4_2_ == 0x10) {
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae3e6;
      anon_unknown_104::SetHas((FieldEntry *)table_local,pMVar45);
    }
    else if (hasbits_local._4_2_ == 0x30) {
      aStack_1e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
      uStack_1d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_local;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae419;
      uVar35 = TcFieldData::tag((TcFieldData *)&parse_fn);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae43f;
      bVar29 = ChangeOneof((TcParseTableBase *)aStack_1e0,(FieldEntry *)uStack_1d8,uVar35 >> 3,
                           (ParseContext *)msg_local,pMVar45);
      uStack_158._0_3_ = CONCAT12(bVar29,(ushort)uStack_158);
    }
    uStack_158._0_2_ = (ushort)(byte)(undefined1)uStack_158;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae468;
    local_160 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                MaybeGetSplitBase(pMVar45,true,(TcParseTableBase *)ptr_local);
    uStack_1e8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 (ulong)CONCAT24(uStack_158._4_2_,(undefined4)uStack_1e8);
    if (uStack_158._4_2_ == 0) {
      uVar34._0_2_ = table_local->has_bits_offset;
      uVar34._2_2_ = table_local->extension_offset;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae4c2;
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  RefAt<google::protobuf::internal::ArenaStringPtr>((void *)local_160,(ulong)uVar34)
      ;
      if ((uStack_158 & 0x10000) != 0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae4de;
        ArenaStringPtr::InitDefault((ArenaStringPtr *)local_168);
      }
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae4ea;
      local_170 = (char **)protobuf::MessageLite::GetArena(pMVar45);
      if ((MessageLite *)local_170 == (MessageLite *)0x0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae535;
        local_178.data = (uint64_t)ArenaStringPtr::MutableNoCopy_abi_cxx11_(local_168,(Arena *)0x0);
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae556;
        param_3_local.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             InlineGreedyStringParser
                       ((string *)local_178,(char *)param_3_local.field_0,(ParseContext *)msg_local)
        ;
      }
      else {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae51c;
        param_3_local.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             EpsCopyInputStream::ReadArenaString
                       ((EpsCopyInputStream *)msg_local,(char *)param_3_local.field_0,
                        (ArenaStringPtr *)local_168,(Arena *)local_170);
      }
      if (param_3_local.field_0 == 0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae57a;
        anon_unknown_104::EnsureArenaStringIsNotDefault(pMVar45,(ArenaStringPtr *)local_168);
      }
      else {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae58b;
        psVar42 = ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)local_168);
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae593;
        local_188 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar42);
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae5cd;
        wire_bytes_01._M_str = ptr_local;
        wire_bytes_01._M_len = local_188._8_8_;
        bVar29 = MpVerifyUtf8(local_188._0_8_,wire_bytes_01,table_local,
                              (FieldEntry *)(uStack_158 >> 0x30),uVar55);
        uStack_158._0_2_ = CONCAT11(bVar29,(undefined1)uStack_158);
      }
    }
    else if (uStack_158._4_2_ == 0x80) {
      if ((uStack_158 & 0x1000000) == 0) {
        uVar17._0_2_ = table_local->has_bits_offset;
        uVar17._2_2_ = table_local->extension_offset;
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae752;
        aStack_1a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     RefAt<absl::lts_20250127::Cord>((void *)local_160,(ulong)uVar17);
      }
      else if ((uStack_158 & 0x10000) == 0) {
        uVar16._0_2_ = table_local->has_bits_offset;
        uVar16._2_2_ = table_local->extension_offset;
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae72f;
        ppCVar43 = RefAt<absl::lts_20250127::Cord*>(pMVar45,(ulong)uVar16);
        aStack_1a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)*ppCVar43;
      }
      else {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae6d8;
        pAVar49 = protobuf::MessageLite::GetArena(pMVar45);
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae6e0;
        FStack_208.table = (TcParseTableBase *)Arena::Create<absl::lts_20250127::Cord>(pAVar49);
        uVar15._0_2_ = table_local->has_bits_offset;
        uVar15._2_2_ = table_local->extension_offset;
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae70c;
        aStack_1a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)FStack_208;
        ppCVar43 = RefAt<absl::lts_20250127::Cord*>(pMVar45,(ulong)uVar15);
        *ppCVar43 = (Cord *)FStack_208;
      }
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae773;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           InlineCordParser((Cord *)aStack_1a8,(char *)param_3_local.field_0,
                            (ParseContext *)msg_local);
      if (param_3_local.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae7a7;
        bVar29 = MpVerifyUtf8((Cord *)aStack_1a8,(TcParseTableBase *)ptr_local,
                              (FieldEntry *)table_local,uStack_158._6_2_);
        uStack_158._0_2_ = CONCAT11(bVar29,(undefined1)uStack_158);
      }
    }
    else {
      if (uStack_158._4_2_ != 0x140) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae7c2;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      uVar14._0_2_ = table_local->has_bits_offset;
      uVar14._2_2_ = table_local->extension_offset;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae5f1;
      aStack_190 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   RefAt<google::protobuf::internal::MicroString>((void *)local_160,(ulong)uVar14);
      if ((uStack_158 & 0x10000) != 0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae60d;
        MicroString::InitDefault((MicroString *)aStack_190);
      }
      uStack_200 = (ParseContext *)msg_local;
      aStack_1f8 = param_3_local.field_0;
      aStack_1f0 = aStack_190;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae643;
      pAVar49 = protobuf::MessageLite::GetArena(pMVar45);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae660;
      param_3_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           EpsCopyInputStream::ReadMicroString
                     (&uStack_200->super_EpsCopyInputStream,(char *)aStack_1f8,
                      (MicroString *)aStack_1f0,pAVar49);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae673;
      _aStack_1a0 = MicroString::Get((MicroString *)aStack_190);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae6ad;
      wire_bytes_02._M_str = ptr_local;
      wire_bytes_02._M_len = (size_t)aStack_198;
      bVar29 = MpVerifyUtf8((TcParser *)aStack_1a0,wire_bytes_02,table_local,
                            (FieldEntry *)(uStack_158 >> 0x30),uVar55);
      uStack_158._0_2_ = CONCAT11(bVar29,(undefined1)uStack_158);
    }
    aStack_210._7_1_ = 1;
    if (param_3_local.field_0 != 0) {
      aStack_210._7_1_ = uStack_158._1_1_ ^ 0xff;
    }
    if ((aStack_210._7_1_ & 1) == 0) {
      aStack_240 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
      aStack_238 = param_3_local.field_0;
      aStack_230 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae891;
      TcFieldData::TcFieldData((TcFieldData *)&uStack_1c0);
      local_b8 = uStack_1c0;
      local_c0.data = aStack_240.data;
      local_c8 = aStack_238;
      local_d0 = aStack_230;
      aStack_d8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr_local;
      aStack_e0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx_local;
      entry = (FieldEntry *)((ulong)entry & 0xffffffffffffff);
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae8ff;
      bVar29 = EpsCopyInputStream::DataAvailable
                         ((EpsCopyInputStream *)aStack_230,(char *)aStack_238);
      if (!bVar29) {
        aStack_258.data = local_c0.data;
        aStack_250 = local_c8;
        aStack_248 = local_d0;
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae93d;
        TcFieldData::TcFieldData((TcFieldData *)&local_f0);
        local_30 = local_f0;
        aStack_38 = aStack_258;
        local_40 = aStack_250;
        aStack_48 = aStack_248;
        local_50.data = aStack_d8.data;
        local_58.data = aStack_e0.data;
        local_10 = aStack_258;
        aStack_18.data = aStack_e0.data;
        local_20 = aStack_d8;
        aStack_28.data._4_2_ = ((TcParseTableBase *)aStack_d8.data)->has_bits_offset;
        aStack_28.data._6_2_ = 0;
        aVar47 = aStack_28;
        aStack_28.data._6_2_ = 0;
        if (aStack_28._4_4_ != 0) {
          aStack_260.data._4_4_ = (undefined4)aStack_e0.data;
          uVar53 = (ulong)(uint)aStack_28._4_4_;
          aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae9bf;
          aStack_28 = aVar47;
          puVar51 = RefAt<unsigned_int>((void *)aStack_258,uVar53);
          *puVar51 = aStack_260._4_4_ | *puVar51;
        }
        return (char *)local_40.data;
      }
      aStack_278.data = local_c0.data;
      aStack_270 = local_c8;
      aStack_268 = local_d0;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaea0c;
      TcFieldData::TcFieldData((TcFieldData *)&entry_offset);
      local_60.data = entry_offset;
      local_68 = aStack_278;
      local_70 = aStack_270;
      local_78 = aStack_268;
      local_80 = aStack_d8;
      local_88 = aStack_e0.data;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaea57;
      uVar32 = UnalignedLoad<unsigned_short>((char *)aStack_270);
      local_98 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 (long)(int)((uint)uVar32 & (uint)*(uint8_t *)((long)local_80 + 8));
      local_90._6_2_ = uVar32;
      if ((local_98.data & 7) != 0) {
        aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaeaa1;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaeab5;
      res = (uint64_t)TcParseTableBase::fast_entry(local_80.data,local_98.data >> 3);
      local_a8.data = (((FastFieldEntry *)res)->bits).field_0.data ^ (ulong)local_90._6_2_;
      aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaeaf4;
      UNRECOVERED_JUMPTABLE_00 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)res);
      local_b0 = local_a8.data;
      pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                          ((MessageLite *)local_68,(char *)local_70,(ParseContext *)local_78,
                           (TcFieldData)local_a8,(TcParseTableBase *)local_80,local_88);
      return pcVar38;
    }
    aStack_228 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pMVar45;
    aStack_220 = param_3_local.field_0;
    aStack_218 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
    aStack_280 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aae824;
    TcFieldData::TcFieldData((TcFieldData *)&aStack_1b0);
    pcVar38 = Error((MessageLite *)aStack_228,(char *)aStack_220,(ParseContext *)aStack_218,
                    (TcFieldData)aStack_1b0,(TcParseTableBase *)ptr_local,(uint64_t)ctx_local);
    return pcVar38;
  case (undefined *)0x1aaeb30:
    local_188._8_8_ = local_b8;
    local_188._0_8_ = local_c0;
    aStack_190 = local_c8;
    aStack_1a0.data = aStack_d8.data;
    aStack_198 = local_d0;
    aStack_228 = local_d0;
    aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaeb7f;
    local_178.data = aStack_2e0.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&local_178);
    aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaeb8f;
    aStack_1a8.data =
         (uint64_t)
         RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                   (aStack_228.data,(ulong)uVar35);
    aStack_1b0.data =
         CONCAT26(((FieldEntry *)aStack_1a8.data)->type_card,
                  CONCAT24(((FieldEntry *)aStack_1a8.data)->type_card,aStack_1b0.data._0_4_)) &
         0xffff0030ffffffff;
    if (aStack_1b0.data._4_2_ == 0x20) {
      uVar23 = aStack_1b0.data._6_2_;
      aStack_1b0.data =
           CONCAT44(aStack_1b0.data._4_4_,CONCAT22(uVar23,aStack_1b0.data._0_2_)) &
           0xffffffff01c0ffff;
      aStack_230.data._4_2_ = aStack_1b0.data._2_2_;
      aStack_230.data._6_2_ = 0;
      if (aStack_1b0.data._2_2_ == 0) {
        aStack_1b8.data = local_178.data;
        pcVar38 = MpRepeatedMessageOrGroup<true,false>
                            ((MessageLite *)local_188._8_8_,(char *)local_188._0_8_,
                             (ParseContext *)aStack_190,(TcFieldData)local_178,
                             (TcParseTableBase *)aStack_198,aStack_1a0.data);
        return pcVar38;
      }
      if (aStack_1b0.data._2_2_ != 0x40) {
        aStack_1c8.data = local_178.data;
        pcVar38 = (**(TailCallParseFunc *)((long)aStack_198 + 0x30))
                            ((MessageLite *)local_188._8_8_,(char *)local_188._0_8_,
                             (ParseContext *)aStack_190,(TcFieldData)local_178,
                             (TcParseTableBase *)aStack_198,aStack_1a0.data);
        return pcVar38;
      }
      uStack_1c0 = local_178.data;
      pcVar38 = MpRepeatedMessageOrGroup<true,true>
                          ((MessageLite *)local_188._8_8_,(char *)local_188._0_8_,
                           (ParseContext *)aStack_190,(TcFieldData)local_178,
                           (TcParseTableBase *)aStack_198,aStack_1a0.data);
      return pcVar38;
    }
    aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaece2;
    uVar35 = TcFieldData::tag((TcFieldData *)&local_178);
    aStack_1d0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 (CONCAT44(uVar35,uVar35) & 0xffffffff00000007);
    uStack_1d8 = CONCAT26(aStack_1b0.data._6_2_,(undefined6)uStack_1d8) & 0x1c0ffffffffffff;
    uStack_1d8._0_6_ = CONCAT15(uStack_1d8._6_2_ == 0x40,(undefined5)uStack_1d8);
    uVar34 = CONCAT22(0,uStack_1d8._6_2_);
    aStack_230.data._0_4_ = uVar34;
    if (uVar34 == 0) {
      if (aStack_1d0._0_4_ == 2) goto LAB_01aaeda5;
    }
    else if ((uVar34 == 0x40) && (aStack_1d0._0_4_ == 3)) {
LAB_01aaeda5:
      uStack_1e8 = CONCAT17(aStack_1b0.data._4_2_ == 0x30,(undefined7)uStack_1e8) &
                   0xff00ffffffffffff;
      if (aStack_1b0.data._4_2_ == 0x10) {
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaede0;
        anon_unknown_104::SetHas((FieldEntry *)aStack_1a8,(MessageLite *)local_188._8_8_);
      }
      else if (uStack_1e8._7_1_ != '\0') {
        aStack_240 = aStack_198;
        aStack_238 = aStack_1a8;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaee13;
        uVar35 = TcFieldData::tag((TcFieldData *)&local_178);
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaee39;
        bVar29 = ChangeOneof((TcParseTableBase *)aStack_240,(FieldEntry *)aStack_238,uVar35 >> 3,
                             (ParseContext *)aStack_190,(MessageLite *)local_188._8_8_);
        uStack_1e8._0_7_ = CONCAT16(bVar29,(undefined6)uStack_1e8);
      }
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaee5b;
      aStack_1f0.data =
           (uint64_t)MaybeGetSplitBase((MessageLite *)local_188._8_8_,true,aStack_198.data);
      local_150 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)local_188._8_8_;
      uStack_158 = aStack_1a0.data;
      local_160 = aStack_198;
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  (ulong)CONCAT24(*(uint16_t *)aStack_198,(undefined4)local_168);
      pZVar25 = (ZeroCopyInputStream *)local_168;
      local_168._4_4_ = (uint)*(uint16_t *)aStack_198;
      if (local_168._4_4_ != 0) {
        aStack_248.data._4_4_ = (int)aStack_1a0.data;
        uVar53 = (ulong)local_168._4_4_;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaeec6;
        local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pZVar25;
        puVar51 = RefAt<unsigned_int>((void *)local_188._8_8_,uVar53);
        *puVar51 = aStack_248._4_4_ | *puVar51;
        pZVar25 = (ZeroCopyInputStream *)local_168;
      }
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pZVar25;
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaeee7;
      aStack_1f8.data =
           (uint64_t)
           RefAt<google::protobuf::MessageLite*>(aStack_1f0.data,(ulong)*(uint32_t *)aStack_1a8);
      aStack_248.data._2_2_ = aStack_1b0.data._6_2_;
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaef0f;
      pFVar44 = TcParseTableBase::field_aux((TcParseTableBase *)aStack_198,(FieldEntry *)aStack_1a8)
      ;
      FStack_208 = *pFVar44;
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaef32;
      uStack_200 = (ParseContext *)GetTableFromAux(aStack_248._2_2_,FStack_208);
      if (((uStack_1e8 & 0x1000000000000) != 0) ||
         (*(MessageLite **)aStack_1f8 == (MessageLite *)0x0)) {
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaef69;
        aStack_250 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)uStack_200;
        local_148 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                    protobuf::MessageLite::GetArena((MessageLite *)local_188._8_8_);
        hasbits_local = aStack_250.data;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaef95;
        pMVar45 = ClassData::New(*(ClassData **)((long)aStack_250 + 0x20),(Arena *)local_148);
        *(MessageLite **)aStack_1f8 = pMVar45;
      }
      aStack_220 = aStack_1f8;
      aStack_218.data = (uint64_t)&aStack_190;
      aStack_210.data = (uint64_t)&uStack_200;
      if ((uStack_1d8 & 0x10000000000) == 0) {
        local_70.data = aStack_190.data;
        local_78 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)local_188._0_8_;
        local_80.data = (uint64_t)&aStack_220;
        aStack_288.data = aStack_190.data;
        aStack_280.data = (long)&local_88 + 4;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf26b;
        EpsCopyInputStream::LimitToken::LimitToken((LimitToken *)aStack_280);
        aStack_38.data = aStack_288.data;
        local_40 = local_78;
        aStack_48 = aStack_280;
        aStack_278.data = aStack_288.data;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf29d;
        aStack_270.data._4_4_ = ReadSize((char **)&local_40);
        local_50.data._4_4_ = aStack_270.data._4_4_;
        if (((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_40.data ==
             (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) ||
           (*(int *)(aStack_278.data + 0x58) < 1)) {
          local_30.data = 0;
        }
        else {
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf2ea;
          EpsCopyInputStream::PushLimit
                    ((EpsCopyInputStream *)&local_50,(char *)aStack_278,(int)local_40.data);
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf2f9;
          EpsCopyInputStream::LimitToken::operator=((LimitToken *)aStack_48,(LimitToken *)&local_50)
          ;
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf304;
          EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)&local_50);
          *(int *)(aStack_278.data + 0x58) = *(int *)(aStack_278.data + 0x58) + -1;
          local_30.data = local_40.data;
        }
        local_78 = local_30.data;
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_30.data ==
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          local_68.data = local_30.data;
          local_98.data._0_4_ = 1;
        }
        else {
          res = CONCAT44(*(undefined4 *)(aStack_288.data + 0x58),(undefined4)res);
          local_20.data = local_80.data;
          aStack_28.data = local_30.data;
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf3e3;
          aStack_2a0.data =
               (uint64_t)
               ParseLoopPreserveNone
                         (*(MessageLite **)*local_80.data,local_30.data,
                          *(ParseContext **)
                           *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)local_80 + 8),
                          *(TcParseTableBase **)
                           *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)local_80 + 0x10));
          local_78 = aStack_2a0;
          if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_2a0.data !=
              (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf40f;
            iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue(res._4_4_);
            aStack_2b0.data._4_4_ = iVar36;
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf426;
            iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue
                               (*(int *)(aStack_288.data + 0x58));
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf43a;
            aStack_2a8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         absl::lts_20250127::log_internal::Check_EQImpl
                                   (aStack_2b0._4_4_,iVar36,"old_depth == depth_");
            if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                 )aStack_2a8.data !=
                (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                 )0x0) {
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf467;
              local_a8 = aStack_2a8;
              pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                                  ((type_identity_t<const_char_*>)aStack_2a8);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf482;
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                         ,0x481,pcVar38);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf490;
              pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                  ((LogMessage *)&local_c0);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf49f;
              absl::lts_20250127::log_internal::Voidify::operator&&
                        ((Voidify *)((long)&local_b0 + 7),pLVar48);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf4ab;
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_c0);
            }
            aStack_2a8.data = 0;
            local_a8.data = 0;
          }
          *(int *)(aStack_288.data + 0x58) = *(int *)(aStack_288.data + 0x58) + 1;
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf4cc;
          EpsCopyInputStream::LimitToken::LimitToken
                    ((LimitToken *)((long)&local_c8 + 4),(LimitToken *)((long)&local_88 + 4));
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf4e1;
          bVar29 = EpsCopyInputStream::PopLimit
                             ((EpsCopyInputStream *)aStack_288,(LimitToken *)((long)&local_c8 + 4));
          aStack_2b0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       (CONCAT53(CONCAT41(aStack_2b0._4_4_,bVar29),CONCAT12(bVar29,aStack_2b0._0_2_)
                                ) ^ 0xff0000);
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf503;
          EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)((long)&local_c8 + 4));
          if (((ulong)aStack_2b0 & 0x10000) == 0) {
            local_68.data = local_78;
            local_98.data._0_4_ = 1;
          }
          else {
            local_68.data = 0;
            local_98.data._0_4_ = 1;
          }
        }
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf575;
        EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)((long)&local_88 + 4));
        aStack_268.data = local_68.data;
      }
      else {
        aStack_d8.data = aStack_190.data;
        aStack_e0.data = local_188._0_8_;
        entry = (FieldEntry *)CONCAT44(aStack_1d0._4_4_,entry._0_4_);
        local_f0.data = (uint64_t)&aStack_220;
        aStack_258.data = aStack_190.data;
        iVar36 = *(int *)(aStack_190.data + 0x58) + -1;
        *(int *)(aStack_190.data + 0x58) = iVar36;
        if (iVar36 < 0) {
          local_d0.data = 0;
        }
        else {
          *(int *)(aStack_190.data + 0x5c) = *(int *)(aStack_190.data + 0x5c) + 1;
          entry_offset = CONCAT44(*(undefined4 *)(aStack_190.data + 0x58),
                                  *(undefined4 *)(aStack_190.data + 0x5c));
          aStack_18.data = local_188._0_8_;
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf094;
          local_10.data = local_f0.data;
          aStack_e0.data =
               (uint64_t)
               ParseLoopPreserveNone
                         (*(MessageLite **)aStack_1f8,(char *)local_188._0_8_,aStack_190.data,
                          (TcParseTableBase *)uStack_200);
          if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_e0.data !=
              (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf0b4;
            iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue(entry_offset._4_4_);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf0cb;
            aStack_260.data._4_4_ = iVar36;
            iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue
                               (*(int *)(aStack_258.data + 0x58));
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf0df;
            _uStack_100 = absl::lts_20250127::log_internal::Check_EQImpl
                                    (aStack_260._4_4_,iVar36,"old_depth == depth_");
            if (_uStack_100 != (Nullable<const_char_*>)0x0) {
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf0fc;
              pcVar38 = absl::lts_20250127::implicit_cast<char_const*>(_uStack_100);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf117;
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&param_3_local,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                         ,0x491,pcVar38);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf123;
              pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                  ((LogMessage *)&param_3_local);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf132;
              absl::lts_20250127::log_internal::Voidify::operator&&
                        ((Voidify *)((long)&parse_fn + 7),pLVar48);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf13e;
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&param_3_local);
            }
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf149;
            aStack_260.data._0_4_ =
                 absl::lts_20250127::log_internal::GetReferenceableValue((undefined4)entry_offset);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf160;
            iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue
                               (*(int *)(aStack_258.data + 0x5c));
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf174;
            msg_local = (MessageLite *)
                        absl::lts_20250127::log_internal::Check_EQImpl
                                  (aStack_260._0_4_,iVar36,"old_group_depth == group_depth_");
            if (msg_local != (MessageLite *)0x0) {
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf191;
              pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                                  ((type_identity_t<const_char_*>)msg_local);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf1ac;
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&table_local,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                         ,0x492,pcVar38);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf1b8;
              pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                  ((LogMessage *)&table_local);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf1c7;
              absl::lts_20250127::log_internal::Voidify::operator&&
                        ((Voidify *)((long)&ptr_local + 7),pLVar48);
              aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf1d3;
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&table_local);
            }
            msg_local = (MessageLite *)0x0;
          }
          *(int *)(aStack_258.data + 0x5c) = *(int *)(aStack_258.data + 0x5c) + -1;
          *(int *)(aStack_258.data + 0x58) = *(int *)(aStack_258.data + 0x58) + 1;
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaf1f9;
          bVar29 = EpsCopyInputStream::ConsumeEndGroup((EpsCopyInputStream *)aStack_258,entry._4_4_)
          ;
          if (((bVar29 ^ 0xffU) & 1) == 0) {
            local_d0.data = aStack_e0.data;
          }
          else {
            local_d0.data = 0;
          }
        }
        aStack_268.data = local_d0.data;
      }
      return (char *)aStack_268.data;
    }
    aStack_1e0.data = local_178.data;
    pcVar38 = (**(TailCallParseFunc *)((long)aStack_198 + 0x30))
                        ((MessageLite *)local_188._8_8_,(char *)local_188._0_8_,
                         (ParseContext *)aStack_190,(TcFieldData)local_178,
                         (TcParseTableBase *)aStack_198,aStack_1a0.data);
    return pcVar38;
  case (undefined *)0x1aaf5a0:
    aStack_2e8.data = local_b8;
    aStack_2f0.data = local_c0.data;
    aStack_2f8 = local_c8;
    aStack_300.data = local_d0.data;
    aStack_308.data = aStack_d8.data;
    uVar35 = TcFieldData::entry_offset((TcFieldData *)&aStack_2e0);
    aStack_310.data =
         (uint64_t)
         RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(aVar47.data,(ulong)uVar35);
    pFStack_318 = TcParseTableBase::field_aux
                            ((TcParseTableBase *)aStack_300,(FieldEntry *)aStack_310);
    iVar33 = (pFStack_318->enum_range).first;
    uStack_31d = (undefined1)iVar33;
    uStack_31c = (ushort)((uint)iVar33 >> 8);
    uStack_31a = (undefined1)((uint)iVar33 >> 0x18);
    bStack_319 = (byte)(pFStack_318->enum_range).last;
    bStack_452 = true;
    if ((bStack_319 & 1) != 0) {
      uVar35 = TcFieldData::tag((TcFieldData *)&aStack_2e0);
      bStack_452 = (uVar35 & 7) != 2;
    }
    if (bStack_452) {
      aStack_328.data = aStack_2e0.data;
      pcVar38 = MpFallback((MessageLite *)aStack_2e8,(char *)aStack_2f0,(ParseContext *)aStack_2f8,
                           (TcFieldData)aStack_2e0,(TcParseTableBase *)aStack_300,aStack_308.data);
      return pcVar38;
    }
    aStack_330.data = (uint64_t)MaybeGetSplitBase(aStack_2e8.data,true,aStack_300.data);
    if ((bStack_319 >> 1 & 1) == 0) {
      pMVar46 = RefAt<google::protobuf::internal::MapFieldBaseForParse>
                          ((void *)aStack_330,(ulong)*(uint *)aStack_310);
      pTStack_468 = (TcParseTableBase *)MapFieldBaseForParse::MutableMap(pMVar46);
    }
    else {
      pTStack_468 = (TcParseTableBase *)
                    RefAt<google::protobuf::internal::UntypedMapBase>
                              ((void *)aStack_330,(ulong)*(uint *)aStack_310);
    }
    uStack_338 = pTStack_468;
    aStack_340.data._4_4_ = TcFieldData::tag((TcFieldData *)&aStack_2e0);
    do {
      aVar47 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               UntypedMapBase::AllocNode((UntypedMapBase *)uStack_338);
      aStack_348 = aVar47;
      TStack_354 = UntypedMapBase::type_info((UntypedMapBase *)uStack_338);
      aStack_350.data = aVar47.data + (long)(int)((uint)TStack_354 & 0xffff);
      aStack_360 = (anon_struct_8_2_e5911a21_for_enum_range)
                   NodeBase::GetVoidKey((NodeBase *)aStack_348);
      uStack_370 = absl::lts_20250127::log_internal::GetReferenceableValue
                             (aStack_350.data - (long)aStack_360);
      pvStack_378 = (void *)absl::lts_20250127::log_internal::GetReferenceableValue(8);
      aStack_368 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   absl::lts_20250127::log_internal::Check_GEImpl<long,unsigned_long>
                             (&uStack_370,(unsigned_long *)&pvStack_378,
                              "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
      pTVar20 = uStack_338;
      aVar47 = aStack_348;
      if ((Nullable<const_char_*>)aStack_368.data != (Nullable<const_char_*>)0x0) {
        pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                            ((type_identity_t<const_char_*>)aStack_368);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)(auStack_398 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0xb2c,pcVar38);
        pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                            ((LogMessage *)(auStack_398 + 8));
        absl::lts_20250127::log_internal::Voidify::operator&&
                  ((Voidify *)((long)&uStack_380 + 7),pLVar48);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)(auStack_398 + 8));
      }
      *(undefined8 *)aStack_360 = 0;
      *(undefined8 *)(aStack_350.data - 8) = 0;
      aStack_3a0.data = (uint64_t)uStack_338;
      absl::lts_20250127::
      Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2866:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2870:19)>
      ::Overload((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                  *)auStack_398,uStack_338);
      UntypedMapBase::
      VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>
                ((UntypedMapBase *)pTVar20,(NodeBase *)aVar47,
                 (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                  )auStack_398._0_8_);
      pTVar20 = uStack_338;
      aVar47 = aStack_348;
      pTStack_3c8 = uStack_338;
      uStack_3d0 = uStack_338;
      uStack_3d8 = &pFStack_318;
      absl::lts_20250127::
      Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2875:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2878:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc:2882:19)>
      ::Overload((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                  *)&aStack_3c0,uStack_338,&pFStack_318,uStack_338);
      f_00.super_anon_class_16_2_4417ab01.aux = (FieldAux **)aStack_3b8;
      f_00.super_anon_class_8_1_ba1d60bc.map = (UntypedMapBase *)aStack_3c0.data;
      f_00.super_anon_class_16_2_4417ab01.map = (UntypedMapBase *)pTStack_3b0;
      UntypedMapBase::
      VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>
                ((UntypedMapBase *)pTVar20,(NodeBase *)aVar47,f_00);
      aVar47 = aStack_2f8;
      paStack_410 = &aStack_348;
      aStack_408.data = (uint64_t)&aStack_2f8;
      uStack_3f8 = &aStack_300;
      aStack_3f0 = aStack_310;
      pTStack_3e8 = uStack_338;
      local_60.data = aStack_2f8.data;
      local_68 = aStack_2f0;
      local_70.data = (uint64_t)&paStack_410;
      aStack_400 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&pFStack_318;
      EpsCopyInputStream::LimitToken::LimitToken((LimitToken *)((long)&local_78 + 4U));
      aStack_28.data = aVar47.data;
      local_30 = local_68;
      aStack_38.data = (long)&local_78 + 4U;
      uVar35 = ReadSize((char **)&local_30);
      local_40.data._4_4_ = uVar35;
      if (((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_30.data ==
           (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) || (*(int *)(aVar47.data + 0x58) < 1))
      {
        local_20.data = 0;
      }
      else {
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&local_40,(char *)aVar47,(int)local_30.data);
        EpsCopyInputStream::LimitToken::operator=((LimitToken *)aStack_38,(LimitToken *)&local_40);
        EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)&local_40);
        *(int *)(aVar47.data + 0x58) = *(int *)(aVar47.data + 0x58) + -1;
        local_20.data = local_30.data;
      }
      local_68.data = local_20.data;
      if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_20.data ==
          (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        local_58.data = local_20.data;
        local_88._0_4_ = 1;
      }
      else {
        local_90 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                   CONCAT44(*(undefined4 *)(aVar47.data + 0x58),(undefined4)local_90);
        local_10.data = local_70.data;
        aStack_18.data = local_20.data;
        local_68.data =
             (uint64_t)
             ParseOneMapEntry(*(NodeBase **)*local_70.data,local_20.data,
                              *(ParseContext **)
                               *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 8),
                              *(FieldAux **)
                               *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 0x10),
                              *(TcParseTableBase **)
                               *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 0x18),
                              *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 0x20),
                              *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(local_70.data + 0x28));
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_68.data !=
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue(local_90._4_4_);
          iVar37 = absl::lts_20250127::log_internal::GetReferenceableValue
                             (*(int *)(aVar47.data + 0x58));
          local_98 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     absl::lts_20250127::log_internal::Check_EQImpl
                               (iVar36,iVar37,"old_depth == depth_");
          if ((Nullable<const_char_*>)local_98.data != (Nullable<const_char_*>)0x0) {
            pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                                ((type_identity_t<const_char_*>)local_98);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x481,pcVar38);
            pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                ((LogMessage *)&local_b0);
            absl::lts_20250127::log_internal::Voidify::operator&&
                      ((Voidify *)((long)&res + 7),pLVar48);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_b0);
          }
          local_98.data = 0;
        }
        *(int *)(aVar47.data + 0x58) = *(int *)(aVar47.data + 0x58) + 1;
        EpsCopyInputStream::LimitToken::LimitToken
                  ((LimitToken *)((long)&local_b8 + 4),(LimitToken *)((long)&local_78 + 4));
        bVar29 = EpsCopyInputStream::PopLimit
                           ((EpsCopyInputStream *)aVar47,(LimitToken *)((long)&local_b8 + 4));
        EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)((long)&local_b8 + 4));
        if (((bVar29 ^ 0xffU) & 1) == 0) {
          local_58.data = local_68.data;
          local_88._0_4_ = 1;
        }
        else {
          local_58.data = 0;
          local_88._0_4_ = 1;
        }
      }
      EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)((long)&local_78 + 4));
      aStack_2f0.data = local_58.data;
      if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_58.data ==
          (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        pAVar49 = UntypedMapBase::arena((UntypedMapBase *)uStack_338);
        if (pAVar49 == (Arena *)0x0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)uStack_338,(NodeBase *)aStack_348);
        }
        aVar22 = aStack_2e8;
        aVar21 = aStack_2f0;
        aVar47 = aStack_2f8;
        TcFieldData::TcFieldData((TcFieldData *)&aStack_418);
        pcVar38 = Error((MessageLite *)aVar22,(char *)aVar21,(ParseContext *)aVar47,
                        (TcFieldData)aStack_418,(TcParseTableBase *)aStack_300,aStack_308.data);
        return pcVar38;
      }
      bStack_4f9 = 0;
      if ((bStack_319 >> 4 & 1) != 0) {
        piVar50 = UntypedMapBase::GetValue<int>((UntypedMapBase *)uStack_338,(NodeBase *)aStack_348)
        ;
        aVar47 = aStack_e0;
        iVar36 = *piVar50;
        local_c8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pFStack_318[1].table;
        local_c0.data._4_4_ = iVar36;
        uVar30 = (ushort)((uint)*(undefined4 *)local_c8 >> 0x10);
        local_d0.data._4_2_ = uVar30;
        local_d0.data._6_2_ = (short)*(undefined4 *)local_c8;
        aStack_d8.data = (long)iVar36 - (long)(short)*(undefined4 *)local_c8;
        if ((ulong)aStack_d8 < (Arena *)(ulong)uVar30) {
          local_b8._0_4_ = CONCAT13(1,(uint3)local_b8);
        }
        else {
          uVar31 = (ushort)*(uint32_t *)(local_c8 + 4);
          aStack_e0.data._6_2_ = uVar31;
          aStack_d8.data = aStack_d8.data - uVar30;
          if ((ulong)aStack_d8 < (Arena *)(ulong)uVar31) {
            local_b8._0_4_ =
                 CONCAT13((*(uint *)(local_c8 + ((aStack_d8.data >> 5) + 2) * 4) >>
                           ((byte)aStack_d8.data & 0x1f) & 1) == 1,(uint3)local_b8);
          }
          else {
            aStack_e0.data._4_2_ = (undefined2)(*(uint32_t *)(local_c8 + 4) >> 0x10);
            aStack_e0.data._0_4_ = (undefined4)aVar47.data;
            local_c8 = local_c8 + (long)(int)((*(uint32_t *)(local_c8 + 4) & 0xffff) / 0x20 + 2) * 4
            ;
            for (entry = (FieldEntry *)0x0;
                entry < (FieldEntry *)(ulong)(ushort)aStack_e0.data._4_2_;
                entry = (FieldEntry *)((long)entry * 2 + (long)iVar52)) {
              iVar37 = *(int *)(local_c8 + (long)entry * 4);
              local_f0.data._4_4_ = iVar37;
              if (iVar37 == iVar36) {
                local_b8._0_4_ = CONCAT13(1,(uint3)local_b8);
                goto LAB_01aaff88;
              }
              iVar52 = 2;
              if (iVar36 < iVar37) {
                iVar52 = 1;
              }
            }
            local_b8._0_4_ = (uint)(uint3)local_b8;
          }
        }
LAB_01aaff88:
        bStack_4f9 = local_b8._3_1_ ^ 0xff;
      }
      if ((bStack_4f9 & 1) == 0) {
        TStack_42c = UntypedMapBase::type_info((UntypedMapBase *)uStack_338);
        TVar28 = UntypedMapBase::TypeInfo::key_type_kind(&TStack_42c);
        switch(TVar28) {
        case kBool:
          KeyMapBase<bool>::InsertOrReplaceNode
                    ((KeyMapBase<bool> *)uStack_338,(KeyNode *)aStack_348);
          break;
        case kU32:
          KeyMapBase<unsigned_int>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_int> *)uStack_338,(KeyNode *)aStack_348);
          break;
        case kU64:
          KeyMapBase<unsigned_long>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_long> *)uStack_338,(KeyNode *)aStack_348);
          break;
        default:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb68);
        case kString:
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InsertOrReplaceNode
                    ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)uStack_338,(KeyNode *)aStack_348);
        }
      }
      else {
        aStack_420.data._4_1_ = bStack_319;
        aStack_420.data._0_4_ = CONCAT13(uStack_31a,CONCAT21(uStack_31c,uStack_31d));
        uStack_428 = (MessageLite *)
                     CONCAT44(CONCAT31(uStack_428._5_3_,bStack_319),aStack_420.data._0_4_);
        WriteMapEntryAsUnknown
                  ((MessageLite *)aStack_2e8,(TcParseTableBase *)aStack_300,
                   (UntypedMapBase *)uStack_338,aStack_340._4_4_,(NodeBase *)aStack_348,
                   (MapAuxInfo)
                   ((uint5)(uint)aStack_420.data._0_4_ |
                   (uint5)CONCAT31(uStack_428._5_3_,bStack_319) << 0x20));
      }
      bVar29 = EpsCopyInputStream::DataAvailable
                         ((EpsCopyInputStream *)aStack_2f8,(char *)aStack_2f0);
      uStack_1c0 = aStack_2e8;
      aVar21 = aStack_2f0;
      aVar47 = aStack_2f8;
      if (((bVar29 ^ 0xffU) & 1) != 0) {
        TcFieldData::TcFieldData((TcFieldData *)&aStack_438);
        aStack_1b8 = aStack_438;
        aStack_1c8.data = aVar21.data;
        aStack_1d0 = aVar47;
        uStack_1d8 = aStack_300.data;
        aStack_1e0.data = aStack_308.data;
        aStack_198.data = uStack_1c0;
        aStack_1a0.data = aStack_308.data;
        aStack_1a8.data = aStack_300.data;
        aStack_1b0.data._4_2_ = *(ushort *)aStack_300;
        aStack_1b0.data._6_2_ = 0;
        aVar47 = aStack_1b0;
        aStack_1b0.data._6_2_ = 0;
        if (aStack_1b0.data._4_4_ != 0) {
          uVar34 = (uint)aStack_308.data;
          uVar53 = (ulong)(uint)aStack_1b0.data._4_4_;
          aStack_1b0 = aVar47;
          puVar51 = RefAt<unsigned_int>((void *)uStack_1c0,uVar53);
          *puVar51 = uVar34 | *puVar51;
        }
        return (char *)aStack_1c8.data;
      }
      local_188._8_8_ = aStack_2f0;
      local_188._0_8_ = &aStack_440;
      aStack_190 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)(int)(uint)*(byte *)aStack_2f0;
      if (aStack_190.data < (Arena *)0x80) {
        aStack_440._0_4_ = (uint)*(byte *)aStack_2f0;
        local_178.data = aStack_2f0.data + 1;
      }
      else {
        hasbits_local = aStack_2f0.data + 1;
        uVar18 = (uint7)((aStack_190.data << 0x39) >> 8);
        table_local._1_7_ = uVar18;
        table_local._0_1_ = *(byte *)hasbits_local;
        if ((*(byte *)hasbits_local & 0x80) == 0) {
          _uStack_100 = (Nullable<const_char_*>)CONCAT44(7,uStack_100);
          aStack_440._0_4_ = (int)table_local << 7 | (uint)((aStack_190.data << 0x39) >> 0x39);
          local_178.data = aStack_2f0.data + 2;
          aStack_190 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_local;
          entry_offset = (uint64_t)table_local;
        }
        else {
          local_150.data = aStack_2f0.data + 2;
          local_148._1_7_ = uVar18 >> 7 | (uint7)((ulong)((long)table_local << 0x39) >> 8);
          local_148.data._0_1_ = *(byte *)local_150;
          if ((*(byte *)local_150 & 0x80) == 0) {
            aStack_440._0_4_ = (int)local_148.data << 0xe | (uint)(local_148._1_7_ >> 0x2a);
            local_178.data = aStack_2f0.data + 3;
            aStack_190 = local_148;
            parse_fn = (TailCallParseFunc)local_148;
          }
          else {
            local_160.data = aStack_2f0.data + 3;
            uStack_158._1_7_ = local_148._1_7_ >> 7 | (uint7)((local_148.data << 0x39) >> 8);
            uStack_158._0_1_ = *(byte *)local_160;
            if ((*(byte *)local_160 & 0x80) == 0) {
              msg_local = (MessageLite *)CONCAT44(0x15,msg_local._0_4_);
              aStack_440._0_4_ = (int)uStack_158 << 0x15 | (uint)(uStack_158._1_7_ >> 0x23);
              local_178.data = aStack_2f0.data + 4;
              aStack_190 = uStack_158;
              param_3_local.field_0 = uStack_158;
            }
            else {
              local_170 = (char **)(aStack_2f0.data + 4);
              local_168._1_7_ = uStack_158._1_7_ >> 7 | (uint7)((uStack_158 << 0x39) >> 8);
              bVar27 = (byte)((ThreadSafeArena *)&((MessageLite *)local_170)->_vptr_MessageLite)->
                             tag_and_id_;
              local_168._0_1_ = bVar27;
              aStack_190 = local_168;
              if ((bVar27 & 0x80) == 0) {
                ctx_local = (ParseContext *)CONCAT44(0x1c,ctx_local._0_4_);
                aStack_440._0_4_ = (int)local_168 << 0x1c | (uint)(local_168._1_7_ >> 0x1c);
                local_178.data = aStack_2f0.data + 5;
                ptr_local = (char *)local_168;
              }
              else {
                aStack_440._0_4_ = 0;
                local_178.data = 0;
              }
            }
          }
        }
      }
      aStack_448.data = local_178.data;
      if (aStack_440._0_4_ != aStack_340._4_4_) {
        TcFieldData::TcFieldData((TcFieldData *)&aStack_450);
        aStack_290 = aStack_450;
        aStack_298.data = uStack_1c0;
        aStack_2a0.data = aVar21.data;
        aStack_2a8 = aVar47;
        aStack_2b0.data = aStack_300.data;
        aStack_2b8.data = aStack_308.data;
        aStack_2c0.data = aStack_2c0.data & 0xffffffffffffff;
        bVar29 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)aVar47,(char *)aVar21);
        aStack_210 = aStack_298;
        aVar21 = aStack_2a0;
        aVar47 = aStack_2a8;
        if (!bVar29) {
          TcFieldData::TcFieldData(&TStack_2c8);
          aStack_218.data = aVar21.data;
          aStack_220 = aVar47;
          aStack_228.data = aStack_2b0.data;
          aStack_230.data = aStack_2b8.data;
          uStack_1e8 = aStack_210.data;
          aStack_1f0.data = aStack_2b8.data;
          aStack_1f8.data = aStack_2b0.data;
          uStack_200 = (ParseContext *)(ulong)CONCAT24(*(ushort *)aStack_2b0,(int)uStack_200);
          uVar53 = (ulong)uStack_200;
          uStack_200._4_4_ = (uint)*(ushort *)aStack_2b0;
          if (uStack_200._4_4_ != 0) {
            uVar34 = (uint)aStack_2b8.data;
            uVar54 = (ulong)uStack_200._4_4_;
            uStack_200 = (ParseContext *)uVar53;
            puVar51 = RefAt<unsigned_int>((void *)aStack_210,uVar54);
            *puVar51 = uVar34 | *puVar51;
          }
          return (char *)aStack_218.data;
        }
        TcFieldData::TcFieldData((TcFieldData *)&aStack_2d0);
        aStack_238 = aStack_2d0;
        aStack_240.data = aStack_210.data;
        aStack_248.data = aVar21.data;
        aStack_250 = aVar47;
        aStack_258.data = aStack_2b0.data;
        aStack_260.data = aStack_2b8.data;
        uVar32 = UnalignedLoad<unsigned_short>((char *)aVar21);
        aStack_270 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (long)(int)((uint)uVar32 & (uint)*(uint8_t *)(aStack_258.data + 8));
        aStack_268.data._6_2_ = uVar32;
        if ((aStack_270.data & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        aStack_278.data =
             (uint64_t)TcParseTableBase::fast_entry(aStack_258.data,aStack_270.data >> 3);
        aStack_280.data =
             (((FastFieldEntry *)aStack_278.data)->bits).field_0.data ^
             (ulong)(ushort)aStack_268._6_2_;
        UNRECOVERED_JUMPTABLE_00 =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)aStack_278);
        aStack_288.data = aStack_280.data;
        pcVar38 = (*UNRECOVERED_JUMPTABLE_00)
                            ((MessageLite *)aStack_240,(char *)aStack_248,(ParseContext *)aStack_250
                             ,(TcFieldData)aStack_280,(TcParseTableBase *)aStack_258,aStack_260.data
                            );
        return pcVar38;
      }
      aStack_2f0.data = local_178.data;
    } while( true );
  }
  local_188._8_8_ = local_b8;
  local_188._0_8_ = local_c0;
  aStack_190 = local_c8;
  aStack_1a0.data = aStack_d8.data;
  aStack_198 = local_d0;
  aStack_228 = local_d0;
  aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa6bf;
  local_178.data = aStack_2e0.data;
  uVar35 = TcFieldData::entry_offset((TcFieldData *)&local_178);
  aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa6cf;
  aStack_1a8.data =
       (uint64_t)
       RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                 (aStack_228.data,(ulong)uVar35);
  aStack_1b0.data =
       CONCAT26(((FieldEntry *)aStack_1a8.data)->type_card,
                CONCAT24(((FieldEntry *)aStack_1a8.data)->type_card,aStack_1b0.data._0_4_)) &
       0xffff0030ffffffff;
  if (aStack_1b0.data._4_2_ == 0x20) {
    uVar23 = aStack_1b0.data._6_2_;
    aStack_1b0.data =
         CONCAT44(aStack_1b0.data._4_4_,CONCAT22(uVar23,aStack_1b0.data._0_2_)) & 0xffffffff01c0ffff
    ;
    aStack_230.data._4_2_ = aStack_1b0.data._2_2_;
    aStack_230.data._6_2_ = 0;
    if (aStack_1b0.data._2_2_ == 0) {
      aStack_1b8.data = local_178.data;
      pcVar38 = MpRepeatedMessageOrGroup<false,false>
                          ((MessageLite *)local_188._8_8_,(char *)local_188._0_8_,
                           (ParseContext *)aStack_190,(TcFieldData)local_178,
                           (TcParseTableBase *)aStack_198,aStack_1a0.data);
      return pcVar38;
    }
    if (aStack_1b0.data._2_2_ != 0x40) {
      aStack_1c8.data = local_178.data;
      pcVar38 = (**(TailCallParseFunc *)((long)aStack_198 + 0x30))
                          ((MessageLite *)local_188._8_8_,(char *)local_188._0_8_,
                           (ParseContext *)aStack_190,(TcFieldData)local_178,
                           (TcParseTableBase *)aStack_198,aStack_1a0.data);
      return pcVar38;
    }
    uStack_1c0 = local_178.data;
    pcVar38 = MpRepeatedMessageOrGroup<false,true>
                        ((MessageLite *)local_188._8_8_,(char *)local_188._0_8_,
                         (ParseContext *)aStack_190,(TcFieldData)local_178,
                         (TcParseTableBase *)aStack_198,aStack_1a0.data);
    return pcVar38;
  }
  aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa822;
  uVar35 = TcFieldData::tag((TcFieldData *)&local_178);
  aStack_1d0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               (CONCAT44(uVar35,uVar35) & 0xffffffff00000007);
  uStack_1d8 = CONCAT26(aStack_1b0.data._6_2_,(undefined6)uStack_1d8) & 0x1c0ffffffffffff;
  uStack_1d8._0_6_ = CONCAT15(uStack_1d8._6_2_ == 0x40,(undefined5)uStack_1d8);
  uVar34 = CONCAT22(0,uStack_1d8._6_2_);
  aStack_230.data._0_4_ = uVar34;
  if (uVar34 == 0) {
    if (aStack_1d0._0_4_ == 2) goto LAB_01aaa8e5;
  }
  else if ((uVar34 == 0x40) && (aStack_1d0._0_4_ == 3)) {
LAB_01aaa8e5:
    uStack_1e8 = CONCAT17(aStack_1b0.data._4_2_ == 0x30,(undefined7)uStack_1e8) & 0xff00ffffffffffff
    ;
    if (aStack_1b0.data._4_2_ == 0x10) {
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa920;
      anon_unknown_104::SetHas((FieldEntry *)aStack_1a8,(MessageLite *)local_188._8_8_);
    }
    else if (uStack_1e8._7_1_ != '\0') {
      aStack_240 = aStack_198;
      aStack_238 = aStack_1a8;
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa953;
      uVar35 = TcFieldData::tag((TcFieldData *)&local_178);
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa979;
      bVar29 = ChangeOneof((TcParseTableBase *)aStack_240,(FieldEntry *)aStack_238,uVar35 >> 3,
                           (ParseContext *)aStack_190,(MessageLite *)local_188._8_8_);
      uStack_1e8._0_7_ = CONCAT16(bVar29,(undefined6)uStack_1e8);
    }
    aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaa998;
    aStack_1f0.data =
         (uint64_t)MaybeGetSplitBase((MessageLite *)local_188._8_8_,false,aStack_198.data);
    local_150 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)local_188._8_8_;
    uStack_158 = aStack_1a0.data;
    local_160 = aStack_198;
    local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                (ulong)CONCAT24(*(uint16_t *)aStack_198,(undefined4)local_168);
    pZVar25 = (ZeroCopyInputStream *)local_168;
    local_168._4_4_ = (uint)*(uint16_t *)aStack_198;
    if (local_168._4_4_ != 0) {
      aStack_248.data._4_4_ = (int)aStack_1a0.data;
      uVar53 = (ulong)local_168._4_4_;
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaa03;
      local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pZVar25;
      puVar51 = RefAt<unsigned_int>((void *)local_188._8_8_,uVar53);
      *puVar51 = aStack_248._4_4_ | *puVar51;
      pZVar25 = (ZeroCopyInputStream *)local_168;
    }
    local_168 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)pZVar25;
    aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaa24;
    aStack_1f8.data =
         (uint64_t)
         RefAt<google::protobuf::MessageLite*>(aStack_1f0.data,(ulong)*(uint32_t *)aStack_1a8);
    aStack_248.data._2_2_ = aStack_1b0.data._6_2_;
    aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaa4c;
    pFVar44 = TcParseTableBase::field_aux((TcParseTableBase *)aStack_198,(FieldEntry *)aStack_1a8);
    FStack_208 = *pFVar44;
    aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaa6f;
    uStack_200 = (ParseContext *)GetTableFromAux(aStack_248._2_2_,FStack_208);
    if (((uStack_1e8 & 0x1000000000000) != 0) || (*(MessageLite **)aStack_1f8 == (MessageLite *)0x0)
       ) {
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaaa6;
      aStack_250 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)uStack_200;
      local_148 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                  protobuf::MessageLite::GetArena((MessageLite *)local_188._8_8_);
      hasbits_local = aStack_250.data;
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaad2;
      pMVar45 = ClassData::New(*(ClassData **)((long)aStack_250 + 0x20),(Arena *)local_148);
      *(MessageLite **)aStack_1f8 = pMVar45;
    }
    aStack_220 = aStack_1f8;
    aStack_218.data = (uint64_t)&aStack_190;
    aStack_210.data = (uint64_t)&uStack_200;
    if ((uStack_1d8 & 0x10000000000) == 0) {
      local_70.data = aStack_190.data;
      local_78 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)local_188._0_8_;
      local_80.data = (uint64_t)&aStack_220;
      aStack_288.data = aStack_190.data;
      aStack_280.data = (long)&local_88 + 4;
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaada8;
      EpsCopyInputStream::LimitToken::LimitToken((LimitToken *)aStack_280);
      aStack_38.data = aStack_288.data;
      local_40 = local_78;
      aStack_48 = aStack_280;
      aStack_278.data = aStack_288.data;
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaadda;
      aStack_270.data._4_4_ = ReadSize((char **)&local_40);
      local_50.data._4_4_ = aStack_270.data._4_4_;
      if (((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_40.data ==
           (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) ||
         (*(int *)(aStack_278.data + 0x58) < 1)) {
        local_30.data = 0;
      }
      else {
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaae27;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&local_50,(char *)aStack_278,(int)local_40.data);
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaae36;
        EpsCopyInputStream::LimitToken::operator=((LimitToken *)aStack_48,(LimitToken *)&local_50);
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaae41;
        EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)&local_50);
        *(int *)(aStack_278.data + 0x58) = *(int *)(aStack_278.data + 0x58) + -1;
        local_30.data = local_40.data;
      }
      aStack_2a0.data = local_30.data;
      local_78 = local_30.data;
      if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)local_30.data ==
          (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
        local_68.data = local_30.data;
        local_98.data._0_4_ = 1;
      }
      else {
        res = CONCAT44(*(undefined4 *)(aStack_288.data + 0x58),(undefined4)res);
        local_20.data = local_80.data;
        aStack_28.data = local_30.data;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaf2e;
        aStack_2a8.data =
             (uint64_t)
             ParseLoopPreserveNone
                       (*(MessageLite **)*local_80.data,local_30.data,
                        *(ParseContext **)
                         *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)local_80 + 8),
                        *(TcParseTableBase **)
                         *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)local_80 + 0x10));
        local_78 = aStack_2a8;
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_2a8.data !=
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaf5a;
          iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue(res._4_4_);
          aStack_2b8.data._4_4_ = iVar36;
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaf71;
          iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue
                             (*(int *)(aStack_288.data + 0x58));
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaf85;
          aStack_2b0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       absl::lts_20250127::log_internal::Check_EQImpl
                                 (aStack_2b8._4_4_,iVar36,"old_depth == depth_");
          if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )aStack_2b0.data !=
              (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )0x0) {
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaafb2;
            local_a8 = aStack_2b0;
            pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                                ((type_identity_t<const_char_*>)aStack_2b0);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaafcd;
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x481,pcVar38);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaafdb;
            pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                ((LogMessage *)&local_c0);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaafea;
            absl::lts_20250127::log_internal::Voidify::operator&&
                      ((Voidify *)((long)&local_b0 + 7),pLVar48);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaaff6;
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_c0);
          }
          aStack_2b0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0;
          local_a8.data = 0;
        }
        *(int *)(aStack_288.data + 0x58) = *(int *)(aStack_288.data + 0x58) + 1;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aab017;
        EpsCopyInputStream::LimitToken::LimitToken
                  ((LimitToken *)((long)&local_c8 + 4),(LimitToken *)((long)&local_88 + 4));
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aab02c;
        bVar29 = EpsCopyInputStream::PopLimit
                           ((EpsCopyInputStream *)aStack_288,(LimitToken *)((long)&local_c8 + 4));
        aStack_2b8 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (CONCAT53(CONCAT41(aStack_2b8._4_4_,bVar29),CONCAT12(bVar29,aStack_2b8._0_2_))
                     ^ 0xff0000);
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aab04e;
        EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)((long)&local_c8 + 4));
        if (((ulong)aStack_2b8 & 0x10000) == 0) {
          local_68.data = local_78;
          local_98.data._0_4_ = 1;
        }
        else {
          local_68.data = 0;
          local_98.data._0_4_ = 1;
        }
      }
      aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aab0c0;
      EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)((long)&local_88 + 4));
      aStack_268.data = local_68.data;
    }
    else {
      aStack_d8.data = aStack_190.data;
      aStack_e0.data = local_188._0_8_;
      entry = (FieldEntry *)CONCAT44(aStack_1d0._4_4_,entry._0_4_);
      local_f0.data = (uint64_t)&aStack_220;
      aStack_258.data = aStack_190.data;
      iVar36 = *(int *)(aStack_190.data + 0x58) + -1;
      *(int *)(aStack_190.data + 0x58) = iVar36;
      if (iVar36 < 0) {
        local_d0.data = 0;
      }
      else {
        *(int *)(aStack_190.data + 0x5c) = *(int *)(aStack_190.data + 0x5c) + 1;
        entry_offset = CONCAT44(*(undefined4 *)(aStack_190.data + 0x58),
                                *(undefined4 *)(aStack_190.data + 0x5c));
        aStack_18.data = local_188._0_8_;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaabd1;
        local_10.data = local_f0.data;
        aStack_e0.data =
             (uint64_t)
             ParseLoopPreserveNone
                       (*(MessageLite **)aStack_1f8,(char *)local_188._0_8_,aStack_190.data,
                        (TcParseTableBase *)uStack_200);
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aStack_e0.data !=
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaabf1;
          iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue(entry_offset._4_4_);
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac08;
          aStack_260.data._4_4_ = iVar36;
          iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue
                             (*(int *)(aStack_258.data + 0x58));
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac1c;
          _uStack_100 = absl::lts_20250127::log_internal::Check_EQImpl
                                  (aStack_260._4_4_,iVar36,"old_depth == depth_");
          if (_uStack_100 != (Nullable<const_char_*>)0x0) {
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac39;
            pcVar38 = absl::lts_20250127::implicit_cast<char_const*>(_uStack_100);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac54;
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&param_3_local,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x491,pcVar38);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac60;
            pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                ((LogMessage *)&param_3_local);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac6f;
            absl::lts_20250127::log_internal::Voidify::operator&&
                      ((Voidify *)((long)&parse_fn + 7),pLVar48);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac7b;
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&param_3_local);
          }
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac86;
          aStack_260.data._0_4_ =
               absl::lts_20250127::log_internal::GetReferenceableValue((undefined4)entry_offset);
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaac9d;
          iVar36 = absl::lts_20250127::log_internal::GetReferenceableValue
                             (*(int *)(aStack_258.data + 0x5c));
          aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaacb1;
          msg_local = (MessageLite *)
                      absl::lts_20250127::log_internal::Check_EQImpl
                                (aStack_260._0_4_,iVar36,"old_group_depth == group_depth_");
          if (msg_local != (MessageLite *)0x0) {
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaacce;
            pcVar38 = absl::lts_20250127::implicit_cast<char_const*>
                                ((type_identity_t<const_char_*>)msg_local);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaace9;
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&table_local,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x492,pcVar38);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaacf5;
            pLVar48 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                ((LogMessage *)&table_local);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaad04;
            absl::lts_20250127::log_internal::Voidify::operator&&
                      ((Voidify *)((long)&ptr_local + 7),pLVar48);
            aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaad10;
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&table_local);
          }
          msg_local = (MessageLite *)0x0;
        }
        *(int *)(aStack_258.data + 0x5c) = *(int *)(aStack_258.data + 0x5c) + -1;
        *(int *)(aStack_258.data + 0x58) = *(int *)(aStack_258.data + 0x58) + 1;
        aStack_2c0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1aaad36;
        bVar29 = EpsCopyInputStream::ConsumeEndGroup((EpsCopyInputStream *)aStack_258,entry._4_4_);
        if (((bVar29 ^ 0xffU) & 1) == 0) {
          local_d0.data = aStack_e0.data;
        }
        else {
          local_d0.data = 0;
        }
      }
      aStack_268.data = local_d0.data;
    }
    return (char *)aStack_268.data;
  }
  aStack_1e0.data = local_178.data;
  pcVar38 = (**(TailCallParseFunc *)((long)aStack_198 + 0x30))
                      ((MessageLite *)local_188._8_8_,(char *)local_188._0_8_,
                       (ParseContext *)aStack_190,(TcFieldData)local_178,
                       (TcParseTableBase *)aStack_198,aStack_1a0.data);
  return pcVar38;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MiniParse(
    PROTOBUF_TC_PARAM_NO_DATA_DECL) {
  PROTOBUF_MUSTTAIL return MiniParse<false>(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}